

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::sse2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vfloat_impl<4> vVar46;
  int iVar47;
  undefined4 uVar48;
  ulong uVar51;
  long lVar52;
  StackEntry *pSVar53;
  ulong extraout_RAX;
  uint uVar49;
  RTCRayN *pRVar55;
  undefined4 uVar50;
  ulong extraout_RAX_00;
  ulong uVar56;
  int iVar57;
  ulong uVar58;
  ulong uVar59;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar60;
  bool bVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  float fVar104;
  float fVar106;
  __m128 a_1;
  undefined1 auVar68 [16];
  undefined2 uVar103;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint uVar105;
  uint uVar107;
  uint uVar108;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar102;
  short sVar109;
  float pp;
  float fVar110;
  float fVar145;
  float fVar146;
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  float fVar156;
  float fVar158;
  vfloat4 a;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar157;
  float fVar159;
  float fVar160;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar161;
  float fVar162;
  float fVar178;
  float fVar180;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar179;
  float fVar181;
  float fVar182;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar200;
  float fVar202;
  vfloat4 v;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar201;
  float fVar203;
  float fVar204;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar205;
  float fVar206;
  float fVar218;
  float fVar220;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar219;
  float fVar221;
  float fVar222;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar223;
  float fVar224;
  float fVar241;
  float fVar243;
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar246;
  float fVar247;
  float fVar254;
  float fVar256;
  undefined1 auVar248 [16];
  float fVar255;
  float fVar257;
  float fVar258;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar259;
  float fVar260;
  float fVar271;
  float fVar273;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar272;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar269;
  undefined1 auVar270 [16];
  float fVar276;
  float fVar283;
  float fVar286;
  undefined1 auVar278 [16];
  float fVar277;
  float fVar284;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar292;
  float fVar293;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar329;
  float fVar332;
  undefined1 auVar322 [16];
  float fVar335;
  undefined1 auVar325 [16];
  float fVar330;
  float fVar333;
  float fVar336;
  undefined1 auVar326 [16];
  float fVar331;
  float fVar334;
  float fVar337;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar343;
  float fVar346;
  float fVar349;
  undefined1 auVar341 [16];
  float fVar344;
  float fVar345;
  float fVar347;
  float fVar348;
  float fVar350;
  float fVar351;
  undefined1 auVar342 [16];
  float fVar352;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar359;
  float fVar366;
  float fVar367;
  __m128 a_2;
  float fVar368;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  uint local_69c;
  undefined1 local_658 [8];
  float fStack_650;
  float fStack_64c;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined8 local_5f8;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5b8 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  Vec3fa dir;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  ulong uVar54;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 uVar144;
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  
  PVar8 = prim[1];
  uVar51 = (ulong)(byte)PVar8;
  fVar180 = *(float *)(prim + uVar51 * 0x19 + 0x12);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar183 = (*(float *)(ray + k * 4) - *(float *)(prim + uVar51 * 0x19 + 6)) * fVar180;
  fVar200 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(prim + uVar51 * 0x19 + 10)) * fVar180;
  fVar202 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(prim + uVar51 * 0x19 + 0xe)) * fVar180;
  fVar161 = *(float *)(ray + k * 4 + 0x40) * fVar180;
  fVar178 = *(float *)(ray + k * 4 + 0x50) * fVar180;
  fVar180 = *(float *)(ray + k * 4 + 0x60) * fVar180;
  uVar50 = *(undefined4 *)(prim + uVar51 * 4 + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar60;
  auVar113._12_2_ = uVar103;
  auVar113._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar60;
  auVar112._10_2_ = uVar103;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar103;
  auVar111._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar29._4_8_ = auVar111._8_8_;
  auVar29._2_2_ = uVar103;
  auVar29._0_2_ = uVar103;
  fVar147 = (float)((int)sVar109 >> 8);
  fVar156 = (float)(auVar29._0_4_ >> 0x18);
  fVar158 = (float)(auVar111._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 5 + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar60;
  auVar116._12_2_ = uVar103;
  auVar116._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar60;
  auVar115._10_2_ = uVar103;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar103;
  auVar114._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar30._4_8_ = auVar114._8_8_;
  auVar30._2_2_ = uVar103;
  auVar30._0_2_ = uVar103;
  fVar205 = (float)((int)sVar109 >> 8);
  fVar218 = (float)(auVar30._0_4_ >> 0x18);
  fVar220 = (float)(auVar114._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 6 + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar60;
  auVar119._12_2_ = uVar103;
  auVar119._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar60;
  auVar118._10_2_ = uVar103;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar103;
  auVar117._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar31._4_8_ = auVar117._8_8_;
  auVar31._2_2_ = uVar103;
  auVar31._0_2_ = uVar103;
  fVar259 = (float)((int)sVar109 >> 8);
  fVar271 = (float)(auVar31._0_4_ >> 0x18);
  fVar273 = (float)(auVar117._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 0xb + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar60;
  auVar122._12_2_ = uVar103;
  auVar122._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar60;
  auVar121._10_2_ = uVar103;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = uVar103;
  auVar120._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar32._4_8_ = auVar120._8_8_;
  auVar32._2_2_ = uVar103;
  auVar32._0_2_ = uVar103;
  fVar67 = (float)((int)sVar109 >> 8);
  fVar104 = (float)(auVar32._0_4_ >> 0x18);
  fVar106 = (float)(auVar120._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 0xc + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar60;
  auVar227._12_2_ = uVar103;
  auVar227._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar60;
  auVar226._10_2_ = uVar103;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar103;
  auVar225._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar33._4_8_ = auVar225._8_8_;
  auVar33._2_2_ = uVar103;
  auVar33._0_2_ = uVar103;
  fVar246 = (float)((int)sVar109 >> 8);
  fVar254 = (float)(auVar33._0_4_ >> 0x18);
  fVar256 = (float)(auVar225._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 0xd + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar60;
  auVar230._12_2_ = uVar103;
  auVar230._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar60;
  auVar229._10_2_ = uVar103;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar103;
  auVar228._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar34._4_8_ = auVar228._8_8_;
  auVar34._2_2_ = uVar103;
  auVar34._0_2_ = uVar103;
  fVar292 = (float)((int)sVar109 >> 8);
  fVar298 = (float)(auVar34._0_4_ >> 0x18);
  fVar300 = (float)(auVar228._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 0x12 + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar60;
  auVar233._12_2_ = uVar103;
  auVar233._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar60;
  auVar232._10_2_ = uVar103;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar103;
  auVar231._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar35._4_8_ = auVar231._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar276 = (float)((int)sVar109 >> 8);
  fVar283 = (float)(auVar35._0_4_ >> 0x18);
  fVar286 = (float)(auVar231._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 0x13 + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar60;
  auVar236._12_2_ = uVar103;
  auVar236._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar60;
  auVar235._10_2_ = uVar103;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._8_2_ = uVar103;
  auVar234._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar36._4_8_ = auVar234._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar303 = (float)((int)sVar109 >> 8);
  fVar308 = (float)(auVar36._0_4_ >> 0x18);
  fVar312 = (float)(auVar234._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar51 * 0x14 + 6);
  uVar144 = (undefined1)((uint)uVar50 >> 0x18);
  uVar103 = CONCAT11(uVar144,uVar144);
  uVar144 = (undefined1)((uint)uVar50 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar103,uVar144),CONCAT14(uVar144,uVar50));
  uVar144 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar144),uVar144);
  sVar109 = CONCAT11((char)uVar50,(char)uVar50);
  uVar60 = CONCAT62(uVar28,sVar109);
  auVar324._8_4_ = 0;
  auVar324._0_8_ = uVar60;
  auVar324._12_2_ = uVar103;
  auVar324._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar323._12_4_ = auVar324._12_4_;
  auVar323._8_2_ = 0;
  auVar323._0_8_ = uVar60;
  auVar323._10_2_ = uVar103;
  auVar322._10_6_ = auVar323._10_6_;
  auVar322._8_2_ = uVar103;
  auVar322._0_8_ = uVar60;
  uVar103 = (undefined2)uVar28;
  auVar37._4_8_ = auVar322._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  fVar110 = (float)((int)sVar109 >> 8);
  fVar145 = (float)(auVar37._0_4_ >> 0x18);
  fVar146 = (float)(auVar322._8_4_ >> 0x18);
  fVar338 = fVar161 * fVar147 + fVar178 * fVar205 + fVar180 * fVar259;
  fVar343 = fVar161 * fVar156 + fVar178 * fVar218 + fVar180 * fVar271;
  fVar346 = fVar161 * fVar158 + fVar178 * fVar220 + fVar180 * fVar273;
  fVar349 = fVar161 * (float)(auVar112._12_4_ >> 0x18) +
            fVar178 * (float)(auVar115._12_4_ >> 0x18) + fVar180 * (float)(auVar118._12_4_ >> 0x18);
  fVar319 = fVar161 * fVar67 + fVar178 * fVar246 + fVar180 * fVar292;
  fVar329 = fVar161 * fVar104 + fVar178 * fVar254 + fVar180 * fVar298;
  fVar332 = fVar161 * fVar106 + fVar178 * fVar256 + fVar180 * fVar300;
  fVar335 = fVar161 * (float)(auVar121._12_4_ >> 0x18) +
            fVar178 * (float)(auVar226._12_4_ >> 0x18) + fVar180 * (float)(auVar229._12_4_ >> 0x18);
  fVar223 = fVar161 * fVar276 + fVar178 * fVar303 + fVar180 * fVar110;
  fVar241 = fVar161 * fVar283 + fVar178 * fVar308 + fVar180 * fVar145;
  fVar243 = fVar161 * fVar286 + fVar178 * fVar312 + fVar180 * fVar146;
  fVar161 = fVar161 * (float)(auVar232._12_4_ >> 0x18) +
            fVar178 * (float)(auVar235._12_4_ >> 0x18) + fVar180 * (float)(auVar323._12_4_ >> 0x18);
  fVar205 = fVar147 * fVar183 + fVar205 * fVar200 + fVar259 * fVar202;
  fVar218 = fVar156 * fVar183 + fVar218 * fVar200 + fVar271 * fVar202;
  fVar220 = fVar158 * fVar183 + fVar220 * fVar200 + fVar273 * fVar202;
  fVar259 = (float)(auVar112._12_4_ >> 0x18) * fVar183 +
            (float)(auVar115._12_4_ >> 0x18) * fVar200 + (float)(auVar118._12_4_ >> 0x18) * fVar202;
  fVar271 = fVar67 * fVar183 + fVar246 * fVar200 + fVar292 * fVar202;
  fVar273 = fVar104 * fVar183 + fVar254 * fVar200 + fVar298 * fVar202;
  fVar292 = fVar106 * fVar183 + fVar256 * fVar200 + fVar300 * fVar202;
  fVar298 = (float)(auVar121._12_4_ >> 0x18) * fVar183 +
            (float)(auVar226._12_4_ >> 0x18) * fVar200 + (float)(auVar229._12_4_ >> 0x18) * fVar202;
  fVar246 = fVar183 * fVar276 + fVar200 * fVar303 + fVar202 * fVar110;
  fVar254 = fVar183 * fVar283 + fVar200 * fVar308 + fVar202 * fVar145;
  fVar256 = fVar183 * fVar286 + fVar200 * fVar312 + fVar202 * fVar146;
  fVar183 = fVar183 * (float)(auVar232._12_4_ >> 0x18) +
            fVar200 * (float)(auVar235._12_4_ >> 0x18) + fVar202 * (float)(auVar323._12_4_ >> 0x18);
  fVar180 = (float)DAT_01f4bd50;
  fVar67 = DAT_01f4bd50._4_4_;
  fVar104 = DAT_01f4bd50._8_4_;
  fVar106 = DAT_01f4bd50._12_4_;
  uVar62 = -(uint)(fVar180 <= ABS(fVar338));
  uVar63 = -(uint)(fVar67 <= ABS(fVar343));
  uVar64 = -(uint)(fVar104 <= ABS(fVar346));
  uVar65 = -(uint)(fVar106 <= ABS(fVar349));
  auVar341._0_4_ = (uint)fVar338 & uVar62;
  auVar341._4_4_ = (uint)fVar343 & uVar63;
  auVar341._8_4_ = (uint)fVar346 & uVar64;
  auVar341._12_4_ = (uint)fVar349 & uVar65;
  auVar186._0_4_ = ~uVar62 & (uint)fVar180;
  auVar186._4_4_ = ~uVar63 & (uint)fVar67;
  auVar186._8_4_ = ~uVar64 & (uint)fVar104;
  auVar186._12_4_ = ~uVar65 & (uint)fVar106;
  auVar186 = auVar186 | auVar341;
  uVar62 = -(uint)(fVar180 <= ABS(fVar319));
  uVar63 = -(uint)(fVar67 <= ABS(fVar329));
  uVar64 = -(uint)(fVar104 <= ABS(fVar332));
  uVar65 = -(uint)(fVar106 <= ABS(fVar335));
  auVar325._0_4_ = (uint)fVar319 & uVar62;
  auVar325._4_4_ = (uint)fVar329 & uVar63;
  auVar325._8_4_ = (uint)fVar332 & uVar64;
  auVar325._12_4_ = (uint)fVar335 & uVar65;
  auVar207._0_4_ = ~uVar62 & (uint)fVar180;
  auVar207._4_4_ = ~uVar63 & (uint)fVar67;
  auVar207._8_4_ = ~uVar64 & (uint)fVar104;
  auVar207._12_4_ = ~uVar65 & (uint)fVar106;
  auVar207 = auVar207 | auVar325;
  uVar62 = -(uint)(fVar180 <= ABS(fVar223));
  uVar63 = -(uint)(fVar67 <= ABS(fVar241));
  uVar64 = -(uint)(fVar104 <= ABS(fVar243));
  uVar65 = -(uint)(fVar106 <= ABS(fVar161));
  auVar237._0_4_ = (uint)fVar223 & uVar62;
  auVar237._4_4_ = (uint)fVar241 & uVar63;
  auVar237._8_4_ = (uint)fVar243 & uVar64;
  auVar237._12_4_ = (uint)fVar161 & uVar65;
  auVar278._0_4_ = ~uVar62 & (uint)fVar180;
  auVar278._4_4_ = ~uVar63 & (uint)fVar67;
  auVar278._8_4_ = ~uVar64 & (uint)fVar104;
  auVar278._12_4_ = ~uVar65 & (uint)fVar106;
  auVar278 = auVar278 | auVar237;
  auVar68 = rcpps(_DAT_01f4bd50,auVar186);
  fVar180 = auVar68._0_4_;
  fVar106 = auVar68._4_4_;
  fVar146 = auVar68._8_4_;
  fVar158 = auVar68._12_4_;
  fVar180 = (1.0 - auVar186._0_4_ * fVar180) * fVar180 + fVar180;
  fVar106 = (1.0 - auVar186._4_4_ * fVar106) * fVar106 + fVar106;
  fVar146 = (1.0 - auVar186._8_4_ * fVar146) * fVar146 + fVar146;
  fVar158 = (1.0 - auVar186._12_4_ * fVar158) * fVar158 + fVar158;
  auVar68 = rcpps(auVar68,auVar207);
  fVar67 = auVar68._0_4_;
  fVar110 = auVar68._4_4_;
  fVar147 = auVar68._8_4_;
  fVar161 = auVar68._12_4_;
  fVar67 = (1.0 - auVar207._0_4_ * fVar67) * fVar67 + fVar67;
  fVar110 = (1.0 - auVar207._4_4_ * fVar110) * fVar110 + fVar110;
  fVar147 = (1.0 - auVar207._8_4_ * fVar147) * fVar147 + fVar147;
  fVar161 = (1.0 - auVar207._12_4_ * fVar161) * fVar161 + fVar161;
  auVar68 = rcpps(auVar68,auVar278);
  fVar104 = auVar68._0_4_;
  fVar145 = auVar68._4_4_;
  fVar156 = auVar68._8_4_;
  fVar178 = auVar68._12_4_;
  fVar104 = (1.0 - auVar278._0_4_ * fVar104) * fVar104 + fVar104;
  fVar145 = (1.0 - auVar278._4_4_ * fVar145) * fVar145 + fVar145;
  fVar156 = (1.0 - auVar278._8_4_ * fVar156) * fVar156 + fVar156;
  fVar178 = (1.0 - auVar278._12_4_ * fVar178) * fVar178 + fVar178;
  uVar60 = *(ulong *)(prim + uVar51 * 7 + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar60;
  auVar264._12_2_ = uVar103;
  auVar264._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar164._12_4_ = auVar264._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar60;
  auVar164._10_2_ = uVar103;
  auVar68._10_6_ = auVar164._10_6_;
  auVar68._8_2_ = uVar103;
  auVar68._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar38._4_8_ = auVar68._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  auVar187._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar218) * fVar106,
                ((float)(int)(short)uVar60 - fVar205) * fVar180);
  auVar187._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar220) * fVar146;
  auVar187._12_4_ = ((float)(auVar164._12_4_ >> 0x10) - fVar259) * fVar158;
  uVar60 = *(ulong *)(prim + uVar51 * 9 + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar295._8_4_ = 0;
  auVar295._0_8_ = uVar60;
  auVar295._12_2_ = uVar103;
  auVar295._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar70._12_4_ = auVar295._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar60;
  auVar70._10_2_ = uVar103;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar103;
  auVar69._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar39._4_8_ = auVar69._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  auVar208._0_4_ = ((float)(int)(short)uVar60 - fVar205) * fVar180;
  auVar208._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar218) * fVar106;
  auVar208._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar220) * fVar146;
  auVar208._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar259) * fVar158;
  uVar60 = *(ulong *)(prim + uVar51 * 0xe + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar60;
  auVar73._12_2_ = uVar103;
  auVar73._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar60;
  auVar72._10_2_ = uVar103;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar103;
  auVar71._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar40._4_8_ = auVar71._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  auVar148._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar273) * fVar110,
                ((float)(int)(short)uVar60 - fVar271) * fVar67);
  auVar148._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar292) * fVar147;
  auVar148._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar298) * fVar161;
  uVar60 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar60;
  auVar76._12_2_ = uVar103;
  auVar76._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar60;
  auVar75._10_2_ = uVar103;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar103;
  auVar74._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar41._4_8_ = auVar74._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  auVar261._0_4_ = ((float)(int)(short)uVar60 - fVar271) * fVar67;
  auVar261._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar273) * fVar110;
  auVar261._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar292) * fVar147;
  auVar261._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar298) * fVar161;
  uVar60 = *(ulong *)(prim + uVar51 * 0x15 + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar60;
  auVar79._12_2_ = uVar103;
  auVar79._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar60;
  auVar78._10_2_ = uVar103;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar103;
  auVar77._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar42._4_8_ = auVar77._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  auVar123._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar254) * fVar145,
                ((float)(int)(short)uVar60 - fVar246) * fVar104);
  auVar123._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar256) * fVar156;
  auVar123._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar183) * fVar178;
  uVar60 = *(ulong *)(prim + uVar51 * 0x17 + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar60;
  auVar82._12_2_ = uVar103;
  auVar82._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar60;
  auVar81._10_2_ = uVar103;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar103;
  auVar80._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar43._4_8_ = auVar80._8_8_;
  auVar43._2_2_ = uVar103;
  auVar43._0_2_ = uVar103;
  auVar248._0_4_ = ((float)(int)(short)uVar60 - fVar246) * fVar104;
  auVar248._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar254) * fVar145;
  auVar248._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar256) * fVar156;
  auVar248._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar183) * fVar178;
  auVar163._8_4_ = auVar187._8_4_;
  auVar163._0_8_ = auVar187._0_8_;
  auVar163._12_4_ = auVar187._12_4_;
  auVar164 = minps(auVar163,auVar208);
  auVar83._8_4_ = auVar148._8_4_;
  auVar83._0_8_ = auVar148._0_8_;
  auVar83._12_4_ = auVar148._12_4_;
  auVar68 = minps(auVar83,auVar261);
  auVar164 = maxps(auVar164,auVar68);
  auVar84._8_4_ = auVar123._8_4_;
  auVar84._0_8_ = auVar123._0_8_;
  auVar84._12_4_ = auVar123._12_4_;
  auVar68 = minps(auVar84,auVar248);
  auVar238._4_4_ = uVar5;
  auVar238._0_4_ = uVar5;
  auVar238._8_4_ = uVar5;
  auVar238._12_4_ = uVar5;
  auVar68 = maxps(auVar68,auVar238);
  auVar68 = maxps(auVar164,auVar68);
  fVar180 = auVar68._0_4_ * 0.99999964;
  fVar67 = auVar68._4_4_ * 0.99999964;
  fVar104 = auVar68._8_4_ * 0.99999964;
  fVar106 = auVar68._12_4_ * 0.99999964;
  auVar164 = maxps(auVar187,auVar208);
  auVar68 = maxps(auVar148,auVar261);
  auVar164 = minps(auVar164,auVar68);
  auVar68 = maxps(auVar123,auVar248);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar149._4_4_ = uVar5;
  auVar149._0_4_ = uVar5;
  auVar149._8_4_ = uVar5;
  auVar149._12_4_ = uVar5;
  auVar68 = minps(auVar68,auVar149);
  auVar68 = minps(auVar164,auVar68);
  auVar124._0_4_ = -(uint)(PVar8 != (Primitive)0x0 && fVar180 <= auVar68._0_4_ * 1.0000004);
  auVar124._4_4_ = -(uint)(1 < (byte)PVar8 && fVar67 <= auVar68._4_4_ * 1.0000004);
  auVar124._8_4_ = -(uint)(2 < (byte)PVar8 && fVar104 <= auVar68._8_4_ * 1.0000004);
  auVar124._12_4_ = -(uint)(3 < (byte)PVar8 && fVar106 <= auVar68._12_4_ * 1.0000004);
  uVar62 = movmskps((uint)(byte)PVar8,auVar124);
  auVar125._0_12_ = mm_lookupmask_ps._240_12_;
  auVar125._12_4_ = 0;
LAB_0029fdb1:
  uVar60 = (ulong)uVar62;
  if (uVar60 == 0) {
    return;
  }
  lVar52 = 0;
  if (uVar60 != 0) {
    for (; (uVar62 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
    }
  }
  uVar60 = uVar60 - 1 & uVar60;
  uVar5 = *(undefined4 *)(prim + lVar52 * 4 + 6);
  lVar52 = lVar52 * 0x40;
  uVar59 = 0;
  if (uVar60 != 0) {
    for (; (uVar60 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
    }
  }
  uVar62 = *(uint *)(prim + 2);
  pPVar1 = prim + lVar52 + uVar51 * 0x19 + 0x16;
  if (uVar60 != 0) {
    uVar58 = uVar60 - 1 & uVar60;
    uVar59 = uVar59 << 6;
    if ((uVar58 != 0) && (lVar11 = 0, uVar58 != 0)) {
      for (; (uVar58 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
  }
  pPVar2 = prim + lVar52 + uVar51 * 0x19 + 0x26;
  pPVar3 = prim + lVar52 + uVar51 * 0x19 + 0x36;
  pPVar4 = prim + lVar52 + uVar51 * 0x19 + 0x46;
  fVar110 = *(float *)(ray + k * 4 + 0x40);
  fVar145 = *(float *)(ray + k * 4 + 0x50);
  fVar156 = *(float *)(ray + k * 4 + 0x60);
  fVar146 = fVar145 * fVar145;
  fVar147 = fVar156 * fVar156;
  fVar178 = fVar146 + fVar110 * fVar110 + fVar147;
  auVar85._0_8_ = CONCAT44(fVar146 + fVar146 + 0.0,fVar178);
  auVar85._8_4_ = fVar146 + fVar147 + fVar147;
  auVar85._12_4_ = fVar146 + 0.0 + 0.0;
  auVar209._8_4_ = auVar85._8_4_;
  auVar209._0_8_ = auVar85._0_8_;
  auVar209._12_4_ = auVar85._12_4_;
  auVar68 = rcpss(auVar209,auVar85);
  fVar200 = (2.0 - auVar68._0_4_ * fVar178) * auVar68._0_4_ *
            (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
              *(float *)(pPVar4 + 8)) * 0.25 - *(float *)(ray + k * 4 + 0x20)) * fVar156 +
            ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
             *(float *)(pPVar4 + 4)) * 0.25 - *(float *)(ray + k * 4 + 0x10)) * fVar145 +
            ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
            *(float *)(ray + k * 4)) * fVar110);
  fVar254 = fVar110 * fVar200 + *(float *)(ray + k * 4);
  fVar256 = fVar145 * fVar200 + *(float *)(ray + k * 4 + 0x10);
  fVar183 = fVar156 * fVar200 + *(float *)(ray + k * 4 + 0x20);
  fVar202 = *(float *)pPVar1 - fVar254;
  fVar223 = *(float *)(pPVar1 + 4) - fVar256;
  fVar241 = *(float *)(pPVar1 + 8) - fVar183;
  fVar243 = *(float *)(pPVar1 + 0xc) - 0.0;
  fVar303 = *(float *)pPVar3 - fVar254;
  fVar308 = *(float *)(pPVar3 + 4) - fVar256;
  fVar312 = *(float *)(pPVar3 + 8) - fVar183;
  fVar319 = *(float *)(pPVar3 + 0xc) - 0.0;
  fVar271 = *(float *)pPVar2 - fVar254;
  fVar273 = *(float *)(pPVar2 + 4) - fVar256;
  fVar276 = *(float *)(pPVar2 + 8) - fVar183;
  fVar283 = *(float *)(pPVar2 + 0xc) - 0.0;
  fVar254 = *(float *)pPVar4 - fVar254;
  fVar256 = *(float *)(pPVar4 + 4) - fVar256;
  fVar183 = *(float *)(pPVar4 + 8) - fVar183;
  fVar329 = *(float *)(pPVar4 + 0xc) - 0.0;
  fVar146 = fVar145 * fVar145;
  fVar286 = fVar110 * fVar110;
  fVar292 = fVar286 + fVar146 + fVar147;
  fVar298 = fVar286 + fVar146 + fVar147;
  fVar300 = fVar286 + fVar146 + fVar147;
  fVar286 = fVar286 + fVar146 + fVar147;
  fVar146 = *(float *)(ray + k * 4 + 0x40);
  fVar205 = ABS(fVar292);
  fVar220 = ABS(fVar298);
  fVar259 = ABS(fVar300);
  fVar246 = ABS(fVar286);
  fVar147 = *(float *)(ray + k * 4 + 0x30);
  fVar218 = fVar147 - fVar200;
  pSVar53 = (StackEntry *)0x1;
  local_69c = 1;
  fVar158 = 0.0;
  fVar161 = 1.0;
  uVar58 = 0;
  do {
    fVar184 = fVar161 - fVar158;
    fVar335 = fVar184 * 0.0 + fVar158;
    fVar338 = fVar184 * 0.33333334 + fVar158;
    fVar343 = fVar184 * 0.6666667 + fVar158;
    fVar346 = fVar184 * 1.0 + fVar158;
    fVar293 = 1.0 - fVar335;
    fVar299 = 1.0 - fVar338;
    fVar301 = 1.0 - fVar343;
    fVar302 = 1.0 - fVar346;
    fVar349 = fVar271 * fVar293 + fVar303 * fVar335;
    fVar284 = fVar271 * fVar299 + fVar303 * fVar338;
    fVar287 = fVar271 * fVar301 + fVar303 * fVar343;
    fVar289 = fVar271 * fVar302 + fVar303 * fVar346;
    fVar332 = fVar273 * fVar293 + fVar308 * fVar335;
    fVar157 = fVar273 * fVar299 + fVar308 * fVar338;
    fVar159 = fVar273 * fVar301 + fVar308 * fVar343;
    fVar160 = fVar273 * fVar302 + fVar308 * fVar346;
    fVar304 = fVar276 * fVar293 + fVar312 * fVar335;
    fVar309 = fVar276 * fVar299 + fVar312 * fVar338;
    fVar313 = fVar276 * fVar301 + fVar312 * fVar343;
    fVar316 = fVar276 * fVar302 + fVar312 * fVar346;
    fVar247 = fVar283 * fVar293 + fVar319 * fVar335;
    fVar255 = fVar283 * fVar299 + fVar319 * fVar338;
    fVar257 = fVar283 * fVar301 + fVar319 * fVar343;
    fVar258 = fVar283 * fVar302 + fVar319 * fVar346;
    fVar162 = (fVar202 * fVar293 + fVar271 * fVar335) * fVar293 + fVar335 * fVar349;
    fVar179 = (fVar202 * fVar299 + fVar271 * fVar338) * fVar299 + fVar338 * fVar284;
    fVar181 = (fVar202 * fVar301 + fVar271 * fVar343) * fVar301 + fVar343 * fVar287;
    fVar182 = (fVar202 * fVar302 + fVar271 * fVar346) * fVar302 + fVar346 * fVar289;
    fVar185 = (fVar223 * fVar293 + fVar273 * fVar335) * fVar293 + fVar335 * fVar332;
    fVar201 = (fVar223 * fVar299 + fVar273 * fVar338) * fVar299 + fVar338 * fVar157;
    fVar203 = (fVar223 * fVar301 + fVar273 * fVar343) * fVar301 + fVar343 * fVar159;
    fVar204 = (fVar223 * fVar302 + fVar273 * fVar346) * fVar302 + fVar346 * fVar160;
    fVar206 = (fVar241 * fVar293 + fVar276 * fVar335) * fVar293 + fVar335 * fVar304;
    fVar219 = (fVar241 * fVar299 + fVar276 * fVar338) * fVar299 + fVar338 * fVar309;
    fVar221 = (fVar241 * fVar301 + fVar276 * fVar343) * fVar301 + fVar343 * fVar313;
    fVar222 = (fVar241 * fVar302 + fVar276 * fVar346) * fVar302 + fVar346 * fVar316;
    fVar224 = (fVar243 * fVar293 + fVar283 * fVar335) * fVar293 + fVar335 * fVar247;
    fVar242 = (fVar243 * fVar299 + fVar283 * fVar338) * fVar299 + fVar338 * fVar255;
    fVar244 = (fVar243 * fVar301 + fVar283 * fVar343) * fVar301 + fVar343 * fVar257;
    fVar245 = (fVar243 * fVar302 + fVar283 * fVar346) * fVar302 + fVar346 * fVar258;
    fVar277 = fVar349 * fVar293 + (fVar303 * fVar293 + fVar254 * fVar335) * fVar335;
    fVar285 = fVar284 * fVar299 + (fVar303 * fVar299 + fVar254 * fVar338) * fVar338;
    fVar288 = fVar287 * fVar301 + (fVar303 * fVar301 + fVar254 * fVar343) * fVar343;
    fVar289 = fVar289 * fVar302 + (fVar303 * fVar302 + fVar254 * fVar346) * fVar346;
    fVar349 = fVar332 * fVar293 + (fVar308 * fVar293 + fVar256 * fVar335) * fVar335;
    fVar157 = fVar157 * fVar299 + (fVar308 * fVar299 + fVar256 * fVar338) * fVar338;
    fVar159 = fVar159 * fVar301 + (fVar308 * fVar301 + fVar256 * fVar343) * fVar343;
    fVar160 = fVar160 * fVar302 + (fVar308 * fVar302 + fVar256 * fVar346) * fVar346;
    fVar304 = fVar304 * fVar293 + (fVar312 * fVar293 + fVar183 * fVar335) * fVar335;
    fVar310 = fVar309 * fVar299 + (fVar312 * fVar299 + fVar183 * fVar338) * fVar338;
    fVar314 = fVar313 * fVar301 + (fVar312 * fVar301 + fVar183 * fVar343) * fVar343;
    fVar317 = fVar316 * fVar302 + (fVar312 * fVar302 + fVar183 * fVar346) * fVar346;
    fVar284 = fVar247 * fVar293 + (fVar319 * fVar293 + fVar329 * fVar335) * fVar335;
    fVar287 = fVar255 * fVar299 + (fVar319 * fVar299 + fVar329 * fVar338) * fVar338;
    fVar257 = fVar257 * fVar301 + (fVar319 * fVar301 + fVar329 * fVar343) * fVar343;
    fVar258 = fVar258 * fVar302 + (fVar319 * fVar302 + fVar329 * fVar346) * fVar346;
    fVar339 = fVar293 * fVar162 + fVar335 * fVar277;
    fVar344 = fVar299 * fVar179 + fVar338 * fVar285;
    fVar347 = fVar301 * fVar181 + fVar343 * fVar288;
    fVar350 = fVar302 * fVar182 + fVar346 * fVar289;
    fVar352 = fVar293 * fVar185 + fVar335 * fVar349;
    fVar356 = fVar299 * fVar201 + fVar338 * fVar157;
    fVar357 = fVar301 * fVar203 + fVar343 * fVar159;
    fVar358 = fVar302 * fVar204 + fVar346 * fVar160;
    fVar320 = fVar293 * fVar206 + fVar335 * fVar304;
    fVar330 = fVar299 * fVar219 + fVar338 * fVar310;
    fVar333 = fVar301 * fVar221 + fVar343 * fVar314;
    fVar336 = fVar302 * fVar222 + fVar346 * fVar317;
    fVar332 = fVar184 * 0.11111111;
    fVar293 = fVar293 * fVar224 + fVar335 * fVar284;
    fVar299 = fVar299 * fVar242 + fVar338 * fVar287;
    auVar294._0_8_ = CONCAT44(fVar299,fVar293);
    auVar294._8_4_ = fVar301 * fVar244 + fVar343 * fVar257;
    auVar294._12_4_ = fVar302 * fVar245 + fVar346 * fVar258;
    fVar309 = (fVar277 - fVar162) * 3.0 * fVar332;
    fVar313 = (fVar285 - fVar179) * 3.0 * fVar332;
    fVar316 = (fVar288 - fVar181) * 3.0 * fVar332;
    fVar290 = (fVar289 - fVar182) * 3.0 * fVar332;
    fVar182 = (fVar349 - fVar185) * 3.0 * fVar332;
    fVar201 = (fVar157 - fVar201) * 3.0 * fVar332;
    fVar247 = (fVar159 - fVar203) * 3.0 * fVar332;
    fVar255 = (fVar160 - fVar204) * 3.0 * fVar332;
    fVar305 = (fVar304 - fVar206) * 3.0 * fVar332;
    fVar311 = (fVar310 - fVar219) * 3.0 * fVar332;
    fVar315 = (fVar314 - fVar221) * 3.0 * fVar332;
    fVar318 = (fVar317 - fVar222) * 3.0 * fVar332;
    fVar335 = fVar332 * (fVar287 - fVar242) * 3.0;
    fVar338 = fVar332 * (fVar257 - fVar244) * 3.0;
    fVar343 = fVar332 * (fVar258 - fVar245) * 3.0;
    auVar188._4_4_ = auVar294._8_4_;
    auVar188._0_4_ = fVar299;
    auVar188._8_4_ = auVar294._12_4_;
    auVar188._12_4_ = 0;
    local_658._4_4_ = fVar299 + fVar335;
    local_658._0_4_ = fVar293 + fVar332 * (fVar284 - fVar224) * 3.0;
    fStack_650 = auVar294._8_4_ + fVar338;
    fStack_64c = auVar294._12_4_ + fVar343;
    auVar126._0_8_ = CONCAT44(auVar294._8_4_ - fVar338,fVar299 - fVar335);
    auVar126._8_4_ = auVar294._12_4_ - fVar343;
    auVar126._12_4_ = 0;
    fVar359 = fVar356 - fVar352;
    fVar366 = fVar357 - fVar356;
    fVar367 = fVar358 - fVar357;
    fVar368 = 0.0 - fVar358;
    fVar287 = fVar330 - fVar320;
    fVar277 = fVar333 - fVar330;
    fVar289 = fVar336 - fVar333;
    fVar301 = 0.0 - fVar336;
    fVar332 = fVar182 * fVar287 - fVar305 * fVar359;
    fVar335 = fVar201 * fVar277 - fVar311 * fVar366;
    fVar338 = fVar247 * fVar289 - fVar315 * fVar367;
    fVar343 = fVar255 * fVar301 - fVar318 * fVar368;
    fVar219 = fVar344 - fVar339;
    fVar222 = fVar347 - fVar344;
    fVar242 = fVar350 - fVar347;
    fVar245 = 0.0 - fVar350;
    fVar160 = fVar305 * fVar219 - fVar309 * fVar287;
    fVar162 = fVar311 * fVar222 - fVar313 * fVar277;
    fVar179 = fVar315 * fVar242 - fVar316 * fVar289;
    fVar181 = fVar318 * fVar245 - fVar290 * fVar301;
    fVar185 = fVar309 * fVar359 - fVar182 * fVar219;
    fVar203 = fVar313 * fVar366 - fVar201 * fVar222;
    fVar204 = fVar316 * fVar367 - fVar247 * fVar242;
    fVar206 = fVar290 * fVar368 - fVar255 * fVar245;
    auVar165._0_4_ = fVar287 * fVar287;
    auVar165._4_4_ = fVar277 * fVar277;
    auVar165._8_4_ = fVar289 * fVar289;
    auVar165._12_4_ = fVar301 * fVar301;
    auVar239._0_4_ = fVar219 * fVar219 + fVar359 * fVar359 + auVar165._0_4_;
    auVar239._4_4_ = fVar222 * fVar222 + fVar366 * fVar366 + auVar165._4_4_;
    auVar239._8_4_ = fVar242 * fVar242 + fVar367 * fVar367 + auVar165._8_4_;
    auVar239._12_4_ = fVar245 * fVar245 + fVar368 * fVar368 + auVar165._12_4_;
    auVar68 = rcpps(auVar165,auVar239);
    fVar346 = auVar68._0_4_;
    fVar349 = auVar68._4_4_;
    fVar157 = auVar68._8_4_;
    fVar159 = auVar68._12_4_;
    fVar346 = (1.0 - fVar346 * auVar239._0_4_) * fVar346 + fVar346;
    fVar349 = (1.0 - fVar349 * auVar239._4_4_) * fVar349 + fVar349;
    fVar157 = (1.0 - fVar157 * auVar239._8_4_) * fVar157 + fVar157;
    fVar159 = (1.0 - fVar159 * auVar239._12_4_) * fVar159 + fVar159;
    fVar221 = fVar287 * fVar201 - fVar359 * fVar311;
    fVar224 = fVar277 * fVar247 - fVar366 * fVar315;
    fVar244 = fVar289 * fVar255 - fVar367 * fVar318;
    fVar284 = fVar301 * 0.0 - fVar368 * 0.0;
    fVar257 = fVar219 * fVar311 - fVar287 * fVar313;
    fVar258 = fVar222 * fVar315 - fVar277 * fVar316;
    fVar285 = fVar242 * fVar318 - fVar289 * fVar290;
    fVar288 = fVar245 * 0.0 - fVar301 * 0.0;
    fVar293 = fVar359 * fVar313 - fVar219 * fVar201;
    fVar299 = fVar366 * fVar316 - fVar222 * fVar247;
    fVar302 = fVar367 * fVar290 - fVar242 * fVar255;
    fVar304 = fVar368 * 0.0 - fVar245 * 0.0;
    auVar353._0_4_ = fVar293 * fVar293;
    auVar353._4_4_ = fVar299 * fVar299;
    auVar353._8_4_ = fVar302 * fVar302;
    auVar353._12_4_ = fVar304 * fVar304;
    auVar86._0_4_ = (fVar332 * fVar332 + fVar160 * fVar160 + fVar185 * fVar185) * fVar346;
    auVar86._4_4_ = (fVar335 * fVar335 + fVar162 * fVar162 + fVar203 * fVar203) * fVar349;
    auVar86._8_4_ = (fVar338 * fVar338 + fVar179 * fVar179 + fVar204 * fVar204) * fVar157;
    auVar86._12_4_ = (fVar343 * fVar343 + fVar181 * fVar181 + fVar206 * fVar206) * fVar159;
    auVar262._0_4_ = (fVar221 * fVar221 + fVar257 * fVar257 + auVar353._0_4_) * fVar346;
    auVar262._4_4_ = (fVar224 * fVar224 + fVar258 * fVar258 + auVar353._4_4_) * fVar349;
    auVar262._8_4_ = (fVar244 * fVar244 + fVar285 * fVar285 + auVar353._8_4_) * fVar157;
    auVar262._12_4_ = (fVar284 * fVar284 + fVar288 * fVar288 + auVar353._12_4_) * fVar159;
    auVar68 = maxps(auVar86,auVar262);
    auVar249._8_4_ = auVar294._8_4_;
    auVar249._0_8_ = auVar294._0_8_;
    auVar249._12_4_ = auVar294._12_4_;
    auVar164 = maxps(auVar249,_local_658);
    auVar263._8_4_ = auVar126._8_4_;
    auVar263._0_8_ = auVar126._0_8_;
    auVar263._12_4_ = 0;
    auVar264 = maxps(auVar263,auVar188);
    auVar264 = maxps(auVar164,auVar264);
    auVar295 = minps(auVar294,_local_658);
    auVar164 = minps(auVar126,auVar188);
    auVar164 = minps(auVar295,auVar164);
    auVar68 = sqrtps(auVar68,auVar68);
    auVar295 = rsqrtps(auVar353,auVar239);
    fVar332 = auVar295._0_4_;
    fVar335 = auVar295._4_4_;
    fVar343 = auVar295._8_4_;
    fVar346 = auVar295._12_4_;
    fVar338 = fVar332 * fVar332 * auVar239._0_4_ * -0.5 * fVar332 + fVar332 * 1.5;
    fVar349 = fVar335 * fVar335 * auVar239._4_4_ * -0.5 * fVar335 + fVar335 * 1.5;
    fVar160 = fVar343 * fVar343 * auVar239._8_4_ * -0.5 * fVar343 + fVar343 * 1.5;
    fVar181 = fVar346 * fVar346 * auVar239._12_4_ * -0.5 * fVar346 + fVar346 * 1.5;
    fVar185 = 0.0 - fVar352;
    fVar203 = 0.0 - fVar356;
    fVar204 = 0.0 - fVar357;
    fVar206 = 0.0 - fVar358;
    fVar340 = 0.0 - fVar320;
    fVar345 = 0.0 - fVar330;
    fVar348 = 0.0 - fVar333;
    fVar351 = 0.0 - fVar336;
    fVar257 = 0.0 - fVar339;
    fVar285 = 0.0 - fVar344;
    fVar293 = 0.0 - fVar347;
    fVar302 = 0.0 - fVar350;
    fVar310 = fVar146 * fVar219 * fVar338 +
              fVar145 * fVar359 * fVar338 + fVar156 * fVar287 * fVar338;
    fVar314 = fVar146 * fVar222 * fVar349 +
              fVar145 * fVar366 * fVar349 + fVar156 * fVar277 * fVar349;
    fVar317 = fVar146 * fVar242 * fVar160 +
              fVar145 * fVar367 * fVar160 + fVar156 * fVar289 * fVar160;
    fVar291 = fVar146 * fVar245 * fVar181 +
              fVar145 * fVar368 * fVar181 + fVar156 * fVar301 * fVar181;
    auVar360._0_4_ = fVar359 * fVar338 * fVar185 + fVar287 * fVar338 * fVar340;
    auVar360._4_4_ = fVar366 * fVar349 * fVar203 + fVar277 * fVar349 * fVar345;
    auVar360._8_4_ = fVar367 * fVar160 * fVar204 + fVar289 * fVar160 * fVar348;
    auVar360._12_4_ = fVar368 * fVar181 * fVar206 + fVar301 * fVar181 * fVar351;
    fVar221 = fVar219 * fVar338 * fVar257 + auVar360._0_4_;
    fVar224 = fVar222 * fVar349 * fVar285 + auVar360._4_4_;
    fVar244 = fVar242 * fVar160 * fVar293 + auVar360._8_4_;
    fVar284 = fVar245 * fVar181 * fVar302 + auVar360._12_4_;
    fVar332 = (fVar146 * fVar257 + fVar145 * fVar185 + fVar156 * fVar340) - fVar310 * fVar221;
    fVar343 = (fVar146 * fVar285 + fVar145 * fVar203 + fVar156 * fVar345) - fVar314 * fVar224;
    fVar157 = (fVar146 * fVar293 + fVar145 * fVar204 + fVar156 * fVar348) - fVar317 * fVar244;
    fVar162 = (fVar146 * fVar302 + fVar145 * fVar206 + fVar156 * fVar351) - fVar291 * fVar284;
    fVar335 = (fVar257 * fVar257 + fVar185 * fVar185 + fVar340 * fVar340) - fVar221 * fVar221;
    fVar346 = (fVar285 * fVar285 + fVar203 * fVar203 + fVar345 * fVar345) - fVar224 * fVar224;
    fVar159 = (fVar293 * fVar293 + fVar204 * fVar204 + fVar348 * fVar348) - fVar244 * fVar244;
    fVar179 = (fVar302 * fVar302 + fVar206 * fVar206 + fVar351 * fVar351) - fVar284 * fVar284;
    fVar258 = (auVar264._0_4_ + auVar68._0_4_) * 1.0000002;
    fVar288 = (auVar264._4_4_ + auVar68._4_4_) * 1.0000002;
    fVar299 = (auVar264._8_4_ + auVar68._8_4_) * 1.0000002;
    fVar304 = (auVar264._12_4_ + auVar68._12_4_) * 1.0000002;
    auVar326._0_4_ = fVar335 - fVar258 * fVar258;
    auVar326._4_4_ = fVar346 - fVar288 * fVar288;
    auVar326._8_4_ = fVar159 - fVar299 * fVar299;
    auVar326._12_4_ = fVar179 - fVar304 * fVar304;
    auVar265._0_4_ = fVar292 - fVar310 * fVar310;
    auVar265._4_4_ = fVar298 - fVar314 * fVar314;
    auVar265._8_4_ = fVar300 - fVar317 * fVar317;
    auVar265._12_4_ = fVar286 - fVar291 * fVar291;
    fVar332 = fVar332 + fVar332;
    fVar343 = fVar343 + fVar343;
    fVar157 = fVar157 + fVar157;
    fVar162 = fVar162 + fVar162;
    auVar250._0_4_ = fVar332 * fVar332 - auVar265._0_4_ * 4.0 * auVar326._0_4_;
    auVar250._4_4_ = fVar343 * fVar343 - auVar265._4_4_ * 4.0 * auVar326._4_4_;
    auVar250._8_4_ = fVar157 * fVar157 - auVar265._8_4_ * 4.0 * auVar326._8_4_;
    auVar250._12_4_ = fVar162 * fVar162 - auVar265._12_4_ * 4.0 * auVar326._12_4_;
    local_4f8._4_4_ = (auVar164._4_4_ - auVar68._4_4_) * 0.99999976;
    local_4f8._0_4_ = (auVar164._0_4_ - auVar68._0_4_) * 0.99999976;
    fStack_4f0 = (auVar164._8_4_ - auVar68._8_4_) * 0.99999976;
    fStack_4ec = (auVar164._12_4_ - auVar68._12_4_) * 0.99999976;
    auVar189._4_4_ = -(uint)(0.0 <= auVar250._4_4_);
    auVar189._0_4_ = -(uint)(0.0 <= auVar250._0_4_);
    auVar189._8_4_ = -(uint)(0.0 <= auVar250._8_4_);
    auVar189._12_4_ = -(uint)(0.0 <= auVar250._12_4_);
    uVar50 = (undefined4)((ulong)pSVar53 >> 0x20);
    iVar47 = movmskps((int)pSVar53,auVar189);
    auVar150._0_8_ = CONCAT44(fVar314 * fVar314,fVar310 * fVar310) & 0x7fffffff7fffffff;
    auVar150._8_4_ = ABS(fVar317 * fVar317);
    auVar150._12_4_ = ABS(fVar291 * fVar291);
    fVar258 = ABS(auVar265._0_4_);
    fVar288 = ABS(auVar265._4_4_);
    fVar299 = ABS(auVar265._8_4_);
    fVar304 = ABS(auVar265._12_4_);
    if (iVar47 == 0) {
      iVar47 = 0;
      auVar267 = _DAT_01f45a40;
      auVar327 = auVar326;
      auVar354 = _DAT_01f45a30;
    }
    else {
      auVar164 = sqrtps(auVar360,auVar250);
      bVar61 = 0.0 <= auVar250._0_4_;
      uVar63 = -(uint)bVar61;
      bVar12 = 0.0 <= auVar250._4_4_;
      uVar64 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar250._8_4_;
      uVar65 = -(uint)bVar13;
      bVar14 = 0.0 <= auVar250._12_4_;
      uVar66 = -(uint)bVar14;
      auVar127._0_4_ = auVar265._0_4_ + auVar265._0_4_;
      auVar127._4_4_ = auVar265._4_4_ + auVar265._4_4_;
      auVar127._8_4_ = auVar265._8_4_ + auVar265._8_4_;
      auVar127._12_4_ = auVar265._12_4_ + auVar265._12_4_;
      auVar68 = rcpps(auVar265,auVar127);
      fVar321 = auVar68._0_4_;
      fVar331 = auVar68._4_4_;
      fVar334 = auVar68._8_4_;
      fVar337 = auVar68._12_4_;
      fVar321 = (1.0 - auVar127._0_4_ * fVar321) * fVar321 + fVar321;
      fVar331 = (1.0 - auVar127._4_4_ * fVar331) * fVar331 + fVar331;
      fVar334 = (1.0 - auVar127._8_4_ * fVar334) * fVar334 + fVar334;
      fVar337 = (1.0 - auVar127._12_4_ * fVar337) * fVar337 + fVar337;
      fVar260 = (-fVar332 - auVar164._0_4_) * fVar321;
      fVar272 = (-fVar343 - auVar164._4_4_) * fVar331;
      fVar274 = (-fVar157 - auVar164._8_4_) * fVar334;
      fVar275 = (-fVar162 - auVar164._12_4_) * fVar337;
      fVar321 = (auVar164._0_4_ - fVar332) * fVar321;
      fVar331 = (auVar164._4_4_ - fVar343) * fVar331;
      fVar334 = (auVar164._8_4_ - fVar157) * fVar334;
      fVar337 = (auVar164._12_4_ - fVar162) * fVar337;
      auVar327._0_4_ = (fVar310 * fVar260 + fVar221) * fVar338;
      auVar327._4_4_ = (fVar314 * fVar272 + fVar224) * fVar349;
      auVar327._8_4_ = (fVar317 * fVar274 + fVar244) * fVar160;
      auVar327._12_4_ = (fVar291 * fVar275 + fVar284) * fVar181;
      local_208 = (fVar310 * fVar321 + fVar221) * fVar338;
      fStack_204 = (fVar314 * fVar331 + fVar224) * fVar349;
      fStack_200 = (fVar317 * fVar334 + fVar244) * fVar160;
      fStack_1fc = (fVar291 * fVar337 + fVar284) * fVar181;
      auVar266._0_4_ = (uint)fVar260 & uVar63;
      auVar266._4_4_ = (uint)fVar272 & uVar64;
      auVar266._8_4_ = (uint)fVar274 & uVar65;
      auVar266._12_4_ = (uint)fVar275 & uVar66;
      auVar354._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x7f8000007f800000;
      auVar354._8_4_ = ~uVar65 & 0x7f800000;
      auVar354._12_4_ = ~uVar66 & 0x7f800000;
      auVar354 = auVar354 | auVar266;
      auVar361._0_4_ = (uint)fVar321 & uVar63;
      auVar361._4_4_ = (uint)fVar331 & uVar64;
      auVar361._8_4_ = (uint)fVar334 & uVar65;
      auVar361._12_4_ = (uint)fVar337 & uVar66;
      auVar267._0_8_ = CONCAT44(~uVar64,~uVar63) & 0xff800000ff800000;
      auVar267._8_4_ = ~uVar65 & 0xff800000;
      auVar267._12_4_ = ~uVar66 & 0xff800000;
      auVar267 = auVar267 | auVar361;
      auVar24._4_4_ = fVar220;
      auVar24._0_4_ = fVar205;
      auVar24._8_4_ = fVar259;
      auVar24._12_4_ = fVar246;
      auVar68 = maxps(auVar24,auVar150);
      fVar321 = auVar68._0_4_ * 1.9073486e-06;
      fVar260 = auVar68._4_4_ * 1.9073486e-06;
      fVar331 = auVar68._8_4_ * 1.9073486e-06;
      fVar272 = auVar68._12_4_ * 1.9073486e-06;
      auVar362._0_4_ = -(uint)(fVar258 < fVar321 && bVar61);
      auVar362._4_4_ = -(uint)(fVar288 < fVar260 && bVar12);
      auVar362._8_4_ = -(uint)(fVar299 < fVar331 && bVar13);
      auVar362._12_4_ = -(uint)(fVar304 < fVar272 && bVar14);
      iVar47 = movmskps(iVar47,auVar362);
      if (iVar47 != 0) {
        uVar63 = -(uint)(auVar326._0_4_ <= 0.0);
        uVar64 = -(uint)(auVar326._4_4_ <= 0.0);
        uVar65 = -(uint)(auVar326._8_4_ <= 0.0);
        uVar66 = -(uint)(auVar326._12_4_ <= 0.0);
        local_638 = CONCAT44(~uVar64,~uVar63) & 0x7f8000007f800000;
        auVar190._0_4_ = (uVar63 & 0xff800000 | (uint)local_638) & auVar362._0_4_;
        auVar190._4_4_ = (uVar64 & 0xff800000 | local_638._4_4_) & auVar362._4_4_;
        auVar190._8_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar362._8_4_;
        auVar190._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar362._12_4_;
        auVar342._0_4_ = ~auVar362._0_4_ & auVar354._0_4_;
        auVar342._4_4_ = ~auVar362._4_4_ & auVar354._4_4_;
        auVar342._8_4_ = ~auVar362._8_4_ & auVar354._8_4_;
        auVar342._12_4_ = ~auVar362._12_4_ & auVar354._12_4_;
        auVar355._0_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar362._0_4_;
        auVar355._4_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar362._4_4_;
        auVar355._8_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar362._8_4_;
        auVar355._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar362._12_4_;
        auVar363._0_4_ = ~auVar362._0_4_ & auVar267._0_4_;
        auVar363._4_4_ = ~auVar362._4_4_ & auVar267._4_4_;
        auVar363._8_4_ = ~auVar362._8_4_ & auVar267._8_4_;
        auVar363._12_4_ = ~auVar362._12_4_ & auVar267._12_4_;
        auVar189._4_4_ = -(uint)((fVar260 <= fVar288 || auVar326._4_4_ <= 0.0) && bVar12);
        auVar189._0_4_ = -(uint)((fVar321 <= fVar258 || auVar326._0_4_ <= 0.0) && bVar61);
        auVar189._8_4_ = -(uint)((fVar331 <= fVar299 || auVar326._8_4_ <= 0.0) && bVar13);
        auVar189._12_4_ = -(uint)((fVar272 <= fVar304 || auVar326._12_4_ <= 0.0) && bVar14);
        auVar267 = auVar363 | auVar355;
        auVar354 = auVar342 | auVar190;
      }
    }
    auVar191._0_4_ = (auVar189._0_4_ << 0x1f) >> 0x1f;
    auVar191._4_4_ = (auVar189._4_4_ << 0x1f) >> 0x1f;
    auVar191._8_4_ = (auVar189._8_4_ << 0x1f) >> 0x1f;
    auVar191._12_4_ = (auVar189._12_4_ << 0x1f) >> 0x1f;
    auVar191 = auVar191 & auVar125;
    iVar47 = movmskps(iVar47,auVar191);
    uVar56 = CONCAT44(uVar50,iVar47);
    if (iVar47 != 0) {
      fVar321 = *(float *)(ray + k * 4 + 0x80);
      auVar306._0_4_ = fVar321 - fVar200;
      auVar306._4_4_ = auVar306._0_4_;
      auVar306._8_4_ = auVar306._0_4_;
      auVar306._12_4_ = auVar306._0_4_;
      auVar264 = minps(auVar306,auVar267);
      auVar27._4_4_ = fVar218;
      auVar27._0_4_ = fVar218;
      auVar27._8_4_ = fVar218;
      auVar27._12_4_ = fVar218;
      auVar164 = maxps(auVar27,auVar354);
      auVar87._0_4_ = fVar185 * fVar182 + fVar340 * fVar305;
      auVar87._4_4_ = fVar203 * fVar201 + fVar345 * fVar311;
      auVar87._8_4_ = fVar204 * fVar247 + fVar348 * fVar315;
      auVar87._12_4_ = fVar206 * fVar255 + fVar351 * fVar318;
      auVar279._0_4_ = fVar309 * fVar146 + fVar182 * fVar145 + fVar305 * fVar156;
      auVar279._4_4_ = fVar313 * fVar146 + fVar201 * fVar145 + fVar311 * fVar156;
      auVar279._8_4_ = fVar316 * fVar146 + fVar247 * fVar145 + fVar315 * fVar156;
      auVar279._12_4_ = fVar290 * fVar146 + fVar255 * fVar145 + fVar318 * fVar156;
      auVar68 = rcpps(auVar87,auVar279);
      fVar182 = auVar68._0_4_;
      fVar185 = auVar68._4_4_;
      fVar203 = auVar68._8_4_;
      fVar204 = auVar68._12_4_;
      fVar182 = ((1.0 - auVar279._0_4_ * fVar182) * fVar182 + fVar182) *
                -(fVar257 * fVar309 + auVar87._0_4_);
      fVar185 = ((1.0 - auVar279._4_4_ * fVar185) * fVar185 + fVar185) *
                -(fVar285 * fVar313 + auVar87._4_4_);
      fVar203 = ((1.0 - auVar279._8_4_ * fVar203) * fVar203 + fVar203) *
                -(fVar293 * fVar316 + auVar87._8_4_);
      fVar204 = ((1.0 - auVar279._12_4_ * fVar204) * fVar204 + fVar204) *
                -(fVar302 * fVar290 + auVar87._12_4_);
      uVar63 = -(uint)(auVar279._0_4_ < 0.0 || ABS(auVar279._0_4_) < 1e-18);
      uVar64 = -(uint)(auVar279._4_4_ < 0.0 || ABS(auVar279._4_4_) < 1e-18);
      uVar65 = -(uint)(auVar279._8_4_ < 0.0 || ABS(auVar279._8_4_) < 1e-18);
      uVar66 = -(uint)(auVar279._12_4_ < 0.0 || ABS(auVar279._12_4_) < 1e-18);
      auVar240._0_4_ = (uint)DAT_01f45a40 & uVar63;
      auVar240._4_4_ = DAT_01f45a40._4_4_ & uVar64;
      auVar240._8_4_ = DAT_01f45a40._8_4_ & uVar65;
      auVar240._12_4_ = DAT_01f45a40._12_4_ & uVar66;
      auVar88._0_4_ = ~uVar63 & (uint)fVar182;
      auVar88._4_4_ = ~uVar64 & (uint)fVar185;
      auVar88._8_4_ = ~uVar65 & (uint)fVar203;
      auVar88._12_4_ = ~uVar66 & (uint)fVar204;
      auVar68 = maxps(auVar164,auVar88 | auVar240);
      uVar63 = -(uint)(0.0 < auVar279._0_4_ || ABS(auVar279._0_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar279._4_4_ || ABS(auVar279._4_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar279._8_4_ || ABS(auVar279._8_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar279._12_4_ || ABS(auVar279._12_4_) < 1e-18);
      auVar89._0_8_ = CONCAT44(uVar64,uVar63) & 0x7f8000007f800000;
      auVar89._8_4_ = uVar65 & 0x7f800000;
      auVar89._12_4_ = uVar66 & 0x7f800000;
      auVar280._0_4_ = ~uVar63 & (uint)fVar182;
      auVar280._4_4_ = ~uVar64 & (uint)fVar185;
      auVar280._8_4_ = ~uVar65 & (uint)fVar203;
      auVar280._12_4_ = ~uVar66 & (uint)fVar204;
      auVar264 = minps(auVar264,auVar280 | auVar89);
      auVar281._4_4_ = fVar156;
      auVar281._0_4_ = fVar156;
      auVar281._8_4_ = fVar156;
      auVar281._12_4_ = fVar156;
      auVar210._0_4_ = (0.0 - fVar356) * -fVar201 + (0.0 - fVar330) * -fVar311;
      auVar210._4_4_ = (0.0 - fVar357) * -fVar247 + (0.0 - fVar333) * -fVar315;
      auVar210._8_4_ = (0.0 - fVar358) * -fVar255 + (0.0 - fVar336) * -fVar318;
      auVar210._12_4_ = 0x80000000;
      auVar166._0_4_ = -fVar313 * fVar146 + -fVar201 * fVar145 + -fVar311 * fVar156;
      auVar166._4_4_ = -fVar316 * fVar146 + -fVar247 * fVar145 + -fVar315 * fVar156;
      auVar166._8_4_ = -fVar290 * fVar146 + -fVar255 * fVar145 + -fVar318 * fVar156;
      auVar166._12_4_ = fVar146 * -0.0 + fVar145 * -0.0 + fVar156 * -0.0;
      auVar164 = rcpps(auVar210,auVar166);
      fVar182 = auVar164._0_4_;
      fVar185 = auVar164._4_4_;
      fVar201 = auVar164._8_4_;
      fVar203 = auVar164._12_4_;
      fVar182 = ((1.0 - auVar166._0_4_ * fVar182) * fVar182 + fVar182) *
                -((0.0 - fVar344) * -fVar313 + auVar210._0_4_);
      fVar185 = ((1.0 - auVar166._4_4_ * fVar185) * fVar185 + fVar185) *
                -((0.0 - fVar347) * -fVar316 + auVar210._4_4_);
      fVar201 = ((1.0 - auVar166._8_4_ * fVar201) * fVar201 + fVar201) *
                -((0.0 - fVar350) * -fVar290 + auVar210._8_4_);
      fVar203 = ((1.0 - auVar166._12_4_ * fVar203) * fVar203 + fVar203) * 0.0;
      uVar63 = -(uint)(auVar166._0_4_ < 0.0 || ABS(auVar166._0_4_) < 1e-18);
      uVar64 = -(uint)(auVar166._4_4_ < 0.0 || ABS(auVar166._4_4_) < 1e-18);
      uVar65 = -(uint)(auVar166._8_4_ < 0.0 || ABS(auVar166._8_4_) < 1e-18);
      uVar66 = -(uint)(auVar166._12_4_ < 0.0 || ABS(auVar166._12_4_) < 1e-18);
      auVar211._0_4_ = (uint)DAT_01f45a40 & uVar63;
      auVar211._4_4_ = DAT_01f45a40._4_4_ & uVar64;
      auVar211._8_4_ = DAT_01f45a40._8_4_ & uVar65;
      auVar211._12_4_ = DAT_01f45a40._12_4_ & uVar66;
      auVar90._0_4_ = ~uVar63 & (uint)fVar182;
      auVar90._4_4_ = ~uVar64 & (uint)fVar185;
      auVar90._8_4_ = ~uVar65 & (uint)fVar201;
      auVar90._12_4_ = ~uVar66 & (uint)fVar203;
      auVar68 = maxps(auVar68,auVar90 | auVar211);
      uVar63 = -(uint)(0.0 < auVar166._0_4_ || ABS(auVar166._0_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar166._4_4_ || ABS(auVar166._4_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar166._8_4_ || ABS(auVar166._8_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar166._12_4_ || ABS(auVar166._12_4_) < 1e-18);
      auVar296._0_8_ = CONCAT44(uVar64,uVar63) & 0x7f8000007f800000;
      auVar296._8_4_ = uVar65 & 0x7f800000;
      auVar296._12_4_ = uVar66 & 0x7f800000;
      auVar167._0_4_ = ~uVar63 & (uint)fVar182;
      auVar167._4_4_ = ~uVar64 & (uint)fVar185;
      auVar167._8_4_ = ~uVar65 & (uint)fVar201;
      auVar167._12_4_ = ~uVar66 & (uint)fVar203;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar264,auVar167 | auVar296);
      fVar182 = auVar68._12_4_;
      fVar185 = auVar68._0_4_;
      fVar201 = auVar68._4_4_;
      fVar203 = auVar68._8_4_;
      auVar364._0_4_ = -(uint)(fVar185 <= tp1.upper.field_0._0_4_) & auVar191._0_4_;
      auVar364._4_4_ = -(uint)(fVar201 <= tp1.upper.field_0._4_4_) & auVar191._4_4_;
      auVar364._8_4_ = -(uint)(fVar203 <= tp1.upper.field_0._8_4_) & auVar191._8_4_;
      auVar364._12_4_ = -(uint)(fVar182 <= tp1.upper.field_0._12_4_) & auVar191._12_4_;
      iVar47 = movmskps(iVar47,auVar364);
      uVar56 = CONCAT44(uVar50,iVar47);
      if (iVar47 != 0) {
        auVar264 = maxps(ZEXT816(0),_local_4f8);
        auVar164 = minps(auVar327,_DAT_01f46a60);
        auVar212._0_12_ = ZEXT812(0);
        auVar212._12_4_ = 0.0;
        auVar295 = maxps(auVar164,auVar212);
        auVar26._4_4_ = fStack_204;
        auVar26._0_4_ = local_208;
        auVar26._8_4_ = fStack_200;
        auVar26._12_4_ = fStack_1fc;
        auVar164 = minps(auVar26,_DAT_01f46a60);
        auVar164 = maxps(auVar164,auVar212);
        local_108[0] = (auVar295._0_4_ + (float)DAT_01f4be10) * (float)DAT_01f4bdb0 * fVar184 +
                       fVar158;
        local_108[1] = (auVar295._4_4_ + DAT_01f4be10._4_4_) * DAT_01f4bdb0._4_4_ * fVar184 +
                       fVar158;
        local_108[2] = (auVar295._8_4_ + DAT_01f4be10._8_4_) * DAT_01f4bdb0._8_4_ * fVar184 +
                       fVar158;
        local_108[3] = (auVar295._12_4_ + DAT_01f4be10._12_4_) * DAT_01f4bdb0._12_4_ * fVar184 +
                       fVar158;
        local_118[0] = (auVar164._0_4_ + (float)DAT_01f4be10) * (float)DAT_01f4bdb0 * fVar184 +
                       fVar158;
        local_118[1] = (auVar164._4_4_ + DAT_01f4be10._4_4_) * DAT_01f4bdb0._4_4_ * fVar184 +
                       fVar158;
        local_118[2] = (auVar164._8_4_ + DAT_01f4be10._8_4_) * DAT_01f4bdb0._8_4_ * fVar184 +
                       fVar158;
        local_118[3] = (auVar164._12_4_ + DAT_01f4be10._12_4_) * DAT_01f4bdb0._12_4_ * fVar184 +
                       fVar158;
        fVar335 = fVar335 - auVar264._0_4_ * auVar264._0_4_;
        fVar346 = fVar346 - auVar264._4_4_ * auVar264._4_4_;
        fVar159 = fVar159 - auVar264._8_4_ * auVar264._8_4_;
        fVar179 = fVar179 - auVar264._12_4_ * auVar264._12_4_;
        auVar91._0_4_ = fVar332 * fVar332 - auVar265._0_4_ * 4.0 * fVar335;
        auVar91._4_4_ = fVar343 * fVar343 - auVar265._4_4_ * 4.0 * fVar346;
        auVar91._8_4_ = fVar157 * fVar157 - auVar265._8_4_ * 4.0 * fVar159;
        auVar91._12_4_ = fVar162 * fVar162 - auVar265._12_4_ * 4.0 * fVar179;
        auVar328._4_4_ = -(uint)(0.0 <= auVar91._4_4_);
        auVar328._0_4_ = -(uint)(0.0 <= auVar91._0_4_);
        auVar328._8_4_ = -(uint)(0.0 <= auVar91._8_4_);
        auVar328._12_4_ = -(uint)(0.0 <= auVar91._12_4_);
        iVar47 = movmskps(iVar47,auVar328);
        if (iVar47 == 0) {
          _local_648 = ZEXT816(0);
          fVar338 = 0.0;
          fVar349 = 0.0;
          fVar160 = 0.0;
          fVar181 = 0.0;
          fVar332 = 0.0;
          fVar343 = 0.0;
          fVar157 = 0.0;
          fVar162 = 0.0;
          _local_618 = ZEXT816(0);
          _local_568 = ZEXT816(0);
          iVar47 = 0;
          auVar251 = _DAT_01f45a40;
          auVar268 = _DAT_01f45a30;
        }
        else {
          auVar264 = sqrtps(_DAT_01f4be10,auVar91);
          auVar128._0_4_ = auVar265._0_4_ + auVar265._0_4_;
          auVar128._4_4_ = auVar265._4_4_ + auVar265._4_4_;
          auVar128._8_4_ = auVar265._8_4_ + auVar265._8_4_;
          auVar128._12_4_ = auVar265._12_4_ + auVar265._12_4_;
          auVar164 = rcpps(_DAT_01f4bdb0,auVar128);
          fVar247 = auVar164._0_4_;
          fVar204 = auVar164._4_4_;
          fVar255 = auVar164._8_4_;
          fVar206 = auVar164._12_4_;
          fVar247 = ((float)DAT_01f46a60 - auVar128._0_4_ * fVar247) * fVar247 + fVar247;
          fVar204 = (DAT_01f46a60._4_4_ - auVar128._4_4_ * fVar204) * fVar204 + fVar204;
          fVar255 = (DAT_01f46a60._8_4_ - auVar128._8_4_ * fVar255) * fVar255 + fVar255;
          fVar206 = (DAT_01f46a60._12_4_ - auVar128._12_4_ * fVar206) * fVar206 + fVar206;
          fVar302 = (-fVar332 - auVar264._0_4_) * fVar247;
          fVar309 = (-fVar343 - auVar264._4_4_) * fVar204;
          fVar313 = (-fVar157 - auVar264._8_4_) * fVar255;
          fVar316 = (-fVar162 - auVar264._12_4_) * fVar206;
          fVar247 = (auVar264._0_4_ - fVar332) * fVar247;
          fVar204 = (auVar264._4_4_ - fVar343) * fVar204;
          fVar255 = (auVar264._8_4_ - fVar157) * fVar255;
          fVar206 = (auVar264._12_4_ - fVar162) * fVar206;
          fVar184 = (fVar310 * fVar302 + fVar221) * fVar338;
          fVar257 = (fVar314 * fVar309 + fVar224) * fVar349;
          fVar285 = (fVar317 * fVar313 + fVar244) * fVar160;
          fVar293 = (fVar291 * fVar316 + fVar284) * fVar181;
          fVar332 = fVar146 * fVar302 - (fVar219 * fVar184 + fVar339);
          fVar343 = fVar146 * fVar309 - (fVar222 * fVar257 + fVar344);
          fVar157 = fVar146 * fVar313 - (fVar242 * fVar285 + fVar347);
          fVar162 = fVar146 * fVar316 - (fVar245 * fVar293 + fVar350);
          local_618._4_4_ = fVar145 * fVar309 - (fVar366 * fVar257 + fVar356);
          local_618._0_4_ = fVar145 * fVar302 - (fVar359 * fVar184 + fVar352);
          fStack_610 = fVar145 * fVar313 - (fVar367 * fVar285 + fVar357);
          fStack_60c = fVar145 * fVar316 - (fVar368 * fVar293 + fVar358);
          local_568._4_4_ = fVar156 * fVar309 - (fVar257 * fVar277 + fVar330);
          local_568._0_4_ = fVar156 * fVar302 - (fVar184 * fVar287 + fVar320);
          fStack_560 = fVar156 * fVar313 - (fVar285 * fVar289 + fVar333);
          fStack_55c = fVar156 * fVar316 - (fVar293 * fVar301 + fVar336);
          fVar338 = (fVar310 * fVar247 + fVar221) * fVar338;
          fVar349 = (fVar314 * fVar204 + fVar224) * fVar349;
          fVar160 = (fVar317 * fVar255 + fVar244) * fVar160;
          fVar181 = (fVar291 * fVar206 + fVar284) * fVar181;
          local_648._4_4_ = fVar146 * fVar204 - (fVar222 * fVar349 + fVar344);
          local_648._0_4_ = fVar146 * fVar247 - (fVar219 * fVar338 + fVar339);
          fStack_640 = fVar146 * fVar255 - (fVar242 * fVar160 + fVar347);
          fStack_63c = fVar146 * fVar206 - (fVar245 * fVar181 + fVar350);
          auVar212._0_4_ = fVar145 * fVar247 - (fVar359 * fVar338 + fVar352);
          auVar212._4_4_ = fVar145 * fVar204 - (fVar366 * fVar349 + fVar356);
          auVar212._8_4_ = fVar145 * fVar255 - (fVar367 * fVar160 + fVar357);
          auVar212._12_4_ = fVar145 * fVar206 - (fVar368 * fVar181 + fVar358);
          bVar61 = 0.0 <= auVar91._0_4_;
          uVar63 = -(uint)bVar61;
          bVar12 = 0.0 <= auVar91._4_4_;
          uVar64 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar91._8_4_;
          uVar65 = -(uint)bVar13;
          bVar14 = 0.0 <= auVar91._12_4_;
          uVar66 = -(uint)bVar14;
          fVar338 = fVar156 * fVar247 - (fVar338 * fVar287 + fVar320);
          fVar349 = fVar156 * fVar204 - (fVar349 * fVar277 + fVar330);
          fVar160 = fVar156 * fVar255 - (fVar160 * fVar289 + fVar333);
          fVar181 = fVar156 * fVar206 - (fVar181 * fVar301 + fVar336);
          auVar307._0_4_ = (uint)fVar302 & uVar63;
          auVar307._4_4_ = (uint)fVar309 & uVar64;
          auVar307._8_4_ = (uint)fVar313 & uVar65;
          auVar307._12_4_ = (uint)fVar316 & uVar66;
          auVar268._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x7f8000007f800000;
          auVar268._8_4_ = ~uVar65 & 0x7f800000;
          auVar268._12_4_ = ~uVar66 & 0x7f800000;
          auVar268 = auVar268 | auVar307;
          auVar192._0_4_ = (uint)fVar247 & uVar63;
          auVar192._4_4_ = (uint)fVar204 & uVar64;
          auVar192._8_4_ = (uint)fVar255 & uVar65;
          auVar192._12_4_ = (uint)fVar206 & uVar66;
          auVar251._0_8_ = CONCAT44(~uVar64,~uVar63) & 0xff800000ff800000;
          auVar251._8_4_ = ~uVar65 & 0xff800000;
          auVar251._12_4_ = ~uVar66 & 0xff800000;
          auVar251 = auVar251 | auVar192;
          auVar25._4_4_ = fVar220;
          auVar25._0_4_ = fVar205;
          auVar25._8_4_ = fVar259;
          auVar25._12_4_ = fVar246;
          auVar164 = maxps(auVar25,auVar150);
          fVar247 = auVar164._0_4_ * 1.9073486e-06;
          fVar204 = auVar164._4_4_ * 1.9073486e-06;
          fVar255 = auVar164._8_4_ * 1.9073486e-06;
          fVar206 = auVar164._12_4_ * 1.9073486e-06;
          auVar193._0_4_ = -(uint)(fVar258 < fVar247 && bVar61);
          auVar193._4_4_ = -(uint)(fVar288 < fVar204 && bVar12);
          auVar193._8_4_ = -(uint)(fVar299 < fVar255 && bVar13);
          auVar193._12_4_ = -(uint)(fVar304 < fVar206 && bVar14);
          iVar47 = movmskps(iVar47,auVar193);
          if (iVar47 == 0) {
          }
          else {
            uVar63 = -(uint)(fVar335 <= 0.0);
            uVar64 = -(uint)(fVar346 <= 0.0);
            uVar65 = -(uint)(fVar159 <= 0.0);
            uVar66 = -(uint)(fVar179 <= 0.0);
            auVar282._0_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar193._0_4_;
            auVar282._4_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar193._4_4_;
            auVar282._8_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar193._8_4_;
            auVar282._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar193._12_4_;
            auVar297._0_4_ = ~auVar193._0_4_ & auVar268._0_4_;
            auVar297._4_4_ = ~auVar193._4_4_ & auVar268._4_4_;
            auVar297._8_4_ = ~auVar193._8_4_ & auVar268._8_4_;
            auVar297._12_4_ = ~auVar193._12_4_ & auVar268._12_4_;
            auVar270._0_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar193._0_4_;
            auVar270._4_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar193._4_4_;
            auVar270._8_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar193._8_4_;
            auVar270._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar193._12_4_;
            auVar199._0_4_ = ~auVar193._0_4_ & auVar251._0_4_;
            auVar199._4_4_ = ~auVar193._4_4_ & auVar251._4_4_;
            auVar199._8_4_ = ~auVar193._8_4_ & auVar251._8_4_;
            auVar199._12_4_ = ~auVar193._12_4_ & auVar251._12_4_;
            auVar328._4_4_ = -(uint)((fVar204 <= fVar288 || fVar346 <= 0.0) && bVar12);
            auVar328._0_4_ = -(uint)((fVar247 <= fVar258 || fVar335 <= 0.0) && bVar61);
            auVar328._8_4_ = -(uint)((fVar255 <= fVar299 || fVar159 <= 0.0) && bVar13);
            auVar328._12_4_ = -(uint)((fVar206 <= fVar304 || fVar179 <= 0.0) && bVar14);
            auVar251 = auVar199 | auVar270;
            auVar268 = auVar297 | auVar282;
          }
        }
        fVar335 = (float)DAT_01f4be20;
        fVar346 = DAT_01f4be20._4_4_;
        fVar159 = DAT_01f4be20._8_4_;
        fVar179 = DAT_01f4be20._12_4_;
        auVar164 = minps((undefined1  [16])tp1.upper.field_0,auVar268);
        aVar269 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar68,auVar251);
        tp1.lower.field_0 = aVar269;
        auVar168._0_4_ = -(uint)(fVar185 <= auVar164._0_4_) & auVar364._0_4_;
        auVar168._4_4_ = -(uint)(fVar201 <= auVar164._4_4_) & auVar364._4_4_;
        auVar168._8_4_ = -(uint)(fVar203 <= auVar164._8_4_) & auVar364._8_4_;
        auVar168._12_4_ = -(uint)(fVar182 <= auVar164._12_4_) & auVar364._12_4_;
        uVar63 = -(uint)(aVar269.v[0] <= tp1.upper.field_0._0_4_) & auVar364._0_4_;
        uVar64 = -(uint)(aVar269.v[1] <= tp1.upper.field_0._4_4_) & auVar364._4_4_;
        auVar92._4_4_ = uVar64;
        auVar92._0_4_ = uVar63;
        uVar65 = -(uint)(aVar269.v[2] <= tp1.upper.field_0._8_4_) & auVar364._8_4_;
        uVar66 = -(uint)(aVar269.v[3] <= tp1.upper.field_0._12_4_) & auVar364._12_4_;
        auVar92._8_4_ = uVar65;
        auVar92._12_4_ = uVar66;
        iVar47 = movmskps(iVar47,auVar92 | auVar168);
        uVar56 = CONCAT44(uVar50,iVar47);
        if (iVar47 != 0) {
          auVar151._0_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar335 <=
                                     ABS((float)local_568._0_4_ * fVar156 +
                                         local_618._0_4_ * fVar145 + fVar332 * fVar146)) &
                             auVar328._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar151._4_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar346 <=
                                     ABS((float)local_568._4_4_ * fVar156 +
                                         local_618._4_4_ * fVar145 + fVar343 * fVar146)) &
                             auVar328._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar151._8_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar159 <=
                                     ABS(fStack_560 * fVar156 + local_618._8_4_ * fVar145 +
                                         fVar157 * fVar146)) & auVar328._8_4_) << 0x1f) >> 0x1f) + 4
                      );
          auVar151._12_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar179 <=
                                     ABS(fStack_55c * fVar156 + local_618._12_4_ * fVar145 +
                                         fVar162 * fVar146)) & auVar328._12_4_) << 0x1f) >> 0x1f) +
                      4);
          auVar93 = ~auVar151 & auVar168;
          while( true ) {
            vVar46.field_0 = tp1.lower.field_0;
            local_368 = auVar93;
            uVar50 = (undefined4)(uVar56 >> 0x20);
            iVar47 = movmskps((int)uVar56,auVar93);
            uVar56 = CONCAT44(uVar50,iVar47);
            if (iVar47 == 0) break;
            uVar49 = auVar93._0_4_;
            uVar105 = auVar93._4_4_;
            uVar107 = auVar93._8_4_;
            uVar108 = auVar93._12_4_;
            auVar129._0_4_ = uVar49 & (uint)fVar185;
            auVar129._4_4_ = uVar105 & (uint)fVar201;
            auVar129._8_4_ = uVar107 & (uint)fVar203;
            auVar129._12_4_ = uVar108 & (uint)fVar182;
            auVar152._0_8_ = CONCAT44(~uVar105,~uVar49) & 0x7f8000007f800000;
            auVar152._8_4_ = ~uVar107 & 0x7f800000;
            auVar152._12_4_ = ~uVar108 & 0x7f800000;
            auVar152 = auVar152 | auVar129;
            auVar169._4_4_ = auVar152._0_4_;
            auVar169._0_4_ = auVar152._4_4_;
            auVar169._8_4_ = auVar152._12_4_;
            auVar169._12_4_ = auVar152._8_4_;
            auVar68 = minps(auVar169,auVar152);
            auVar130._0_8_ = auVar68._8_8_;
            auVar130._8_4_ = auVar68._0_4_;
            auVar130._12_4_ = auVar68._4_4_;
            auVar68 = minps(auVar130,auVar68);
            auVar131._0_8_ =
                 CONCAT44(-(uint)(auVar68._4_4_ == auVar152._4_4_) & uVar105,
                          -(uint)(auVar68._0_4_ == auVar152._0_4_) & uVar49);
            auVar131._8_4_ = -(uint)(auVar68._8_4_ == auVar152._8_4_) & uVar107;
            auVar131._12_4_ = -(uint)(auVar68._12_4_ == auVar152._12_4_) & uVar108;
            iVar47 = movmskps(iVar47,auVar131);
            if (iVar47 != 0) {
              auVar93._8_4_ = auVar131._8_4_;
              auVar93._0_8_ = auVar131._0_8_;
              auVar93._12_4_ = auVar131._12_4_;
            }
            uVar48 = movmskps(iVar47,auVar93);
            uVar54 = CONCAT44(uVar50,uVar48);
            uVar56 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
              }
            }
            *(undefined4 *)(local_368 + uVar56 * 4) = 0;
            auVar16._4_4_ = fVar223;
            auVar16._0_4_ = fVar202;
            auVar16._8_4_ = fVar241;
            auVar16._12_4_ = fVar243;
            auVar22._4_4_ = fVar273;
            auVar22._0_4_ = fVar271;
            auVar22._8_4_ = fVar276;
            auVar22._12_4_ = fVar283;
            auVar164 = minps(auVar16,auVar22);
            auVar264 = maxps(auVar16,auVar22);
            auVar20._4_4_ = fVar308;
            auVar20._0_4_ = fVar303;
            auVar20._8_4_ = fVar312;
            auVar20._12_4_ = fVar319;
            auVar18._4_4_ = fVar256;
            auVar18._0_4_ = fVar254;
            auVar18._8_4_ = fVar183;
            auVar18._12_4_ = fVar329;
            auVar68 = minps(auVar20,auVar18);
            auVar164 = minps(auVar164,auVar68);
            auVar68 = maxps(auVar20,auVar18);
            auVar264 = maxps(auVar264,auVar68);
            auVar170._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
            auVar170._8_4_ = auVar164._8_4_ & 0x7fffffff;
            auVar170._12_4_ = auVar164._12_4_ & 0x7fffffff;
            auVar94._0_8_ = auVar264._0_8_ & 0x7fffffff7fffffff;
            auVar94._8_4_ = auVar264._8_4_ & 0x7fffffff;
            auVar94._12_4_ = ABS(auVar264._12_4_);
            auVar68 = maxps(auVar170,auVar94);
            fVar332 = auVar68._4_4_;
            if (auVar68._4_4_ <= auVar68._0_4_) {
              fVar332 = auVar68._0_4_;
            }
            auVar171._8_8_ = auVar68._8_8_;
            auVar171._0_8_ = auVar68._8_8_;
            if (auVar68._8_4_ <= fVar332) {
              auVar171._0_4_ = fVar332;
            }
            fVar157 = auVar171._0_4_ * 1.9073486e-06;
            fVar332 = local_108[uVar56];
            fVar343 = local_118[uVar56 - 8];
            lVar52 = 5;
            do {
              bVar61 = lVar52 == 0;
              lVar52 = lVar52 + -1;
              if (bVar61) goto LAB_002a168e;
              fVar206 = SQRT(fVar178) * 1.9073486e-06 * fVar343;
              fVar162 = 1.0 - fVar332;
              fVar204 = fVar271 * fVar162 + fVar303 * fVar332;
              fVar255 = fVar273 * fVar162 + fVar308 * fVar332;
              fVar184 = fVar276 * fVar162 + fVar312 * fVar332;
              fVar221 = fVar283 * fVar162 + fVar319 * fVar332;
              fVar219 = (fVar202 * fVar162 + fVar271 * fVar332) * fVar162 + fVar332 * fVar204;
              fVar222 = (fVar223 * fVar162 + fVar273 * fVar332) * fVar162 + fVar332 * fVar255;
              fVar224 = (fVar241 * fVar162 + fVar276 * fVar332) * fVar162 + fVar332 * fVar184;
              fVar247 = (fVar243 * fVar162 + fVar283 * fVar332) * fVar162 + fVar332 * fVar221;
              fVar245 = fVar204 * fVar162 + (fVar303 * fVar162 + fVar254 * fVar332) * fVar332;
              fVar287 = fVar255 * fVar162 + (fVar308 * fVar162 + fVar256 * fVar332) * fVar332;
              fVar258 = fVar184 * fVar162 + (fVar312 * fVar162 + fVar183 * fVar332) * fVar332;
              fVar204 = fVar221 * fVar162 + (fVar319 * fVar162 + fVar329 * fVar332) * fVar332;
              fVar244 = fVar162 * fVar247 + fVar332 * fVar204;
              fVar284 = (fVar245 - fVar219) * 3.0;
              fVar257 = (fVar287 - fVar222) * 3.0;
              fVar277 = (fVar258 - fVar224) * 3.0;
              fVar285 = (fVar204 - fVar247) * 3.0;
              fVar247 = fVar162 * 6.0;
              fVar221 = (fVar332 - (fVar162 + fVar162)) * 6.0;
              fVar242 = (fVar162 - (fVar332 + fVar332)) * 6.0;
              fVar184 = fVar332 * 6.0;
              fVar204 = fVar247 * fVar202 +
                        fVar221 * fVar271 + fVar242 * fVar303 + fVar184 * fVar254;
              fVar255 = fVar247 * fVar223 +
                        fVar221 * fVar273 + fVar242 * fVar308 + fVar184 * fVar256;
              fVar247 = fVar247 * fVar241 +
                        fVar221 * fVar276 + fVar242 * fVar312 + fVar184 * fVar183;
              fVar184 = (fVar343 * fVar110 + 0.0) - (fVar162 * fVar219 + fVar332 * fVar245);
              fVar219 = (fVar343 * fVar145 + 0.0) - (fVar162 * fVar222 + fVar332 * fVar287);
              fVar221 = (fVar343 * fVar156 + 0.0) - (fVar162 * fVar224 + fVar332 * fVar258);
              fVar222 = (fVar343 * 0.0 + 0.0) - fVar244;
              fVar162 = fVar219 * fVar219;
              fStack_610 = fVar221 * fVar221;
              fStack_60c = fVar222 * fVar222;
              local_618._0_4_ = fVar162 + fVar184 * fVar184 + fStack_610;
              local_618._4_4_ = fVar162 + fVar162 + fStack_60c;
              fStack_610 = fVar162 + fStack_610 + fStack_610;
              fStack_60c = fVar162 + fStack_60c + fStack_60c;
              fVar162 = fVar157;
              if (fVar157 <= fVar206) {
                fVar162 = fVar206;
              }
              fVar224 = fVar257 * fVar257 + fVar284 * fVar284 + fVar277 * fVar277;
              auVar68 = ZEXT416((uint)fVar224);
              auVar164 = rsqrtss(ZEXT416((uint)fVar224),auVar68);
              fVar206 = auVar164._0_4_;
              fVar242 = fVar206 * 1.5 - fVar206 * fVar206 * fVar224 * 0.5 * fVar206;
              fVar289 = fVar284 * fVar242;
              fVar293 = fVar257 * fVar242;
              fVar299 = fVar277 * fVar242;
              fVar301 = fVar285 * fVar242;
              fVar288 = fVar277 * fVar247 + fVar257 * fVar255 + fVar284 * fVar204;
              auVar68 = rcpss(auVar68,auVar68);
              fVar206 = (2.0 - fVar224 * auVar68._0_4_) * auVar68._0_4_;
              fVar245 = fVar219 * fVar293;
              fVar287 = fVar221 * fVar299;
              fVar258 = fVar222 * fVar301;
              fVar304 = fVar245 + fVar184 * fVar289 + fVar287;
              fVar309 = fVar245 + fVar245 + fVar258;
              fVar287 = fVar245 + fVar287 + fVar287;
              fVar258 = fVar245 + fVar258 + fVar258;
              fVar245 = (SQRT((float)local_618._0_4_) + 1.0) * (fVar157 / SQRT(fVar224)) +
                        SQRT((float)local_618._0_4_) * fVar157 + fVar162;
              fVar302 = fVar301 * -fVar285;
              fVar206 = fVar299 * -fVar277 + fVar293 * -fVar257 + fVar289 * -fVar284 +
                        fVar206 * (fVar224 * fVar247 - fVar288 * fVar277) * fVar242 * fVar221 +
                        fVar206 * (fVar224 * fVar255 - fVar288 * fVar257) * fVar242 * fVar219 +
                        fVar206 * (fVar224 * fVar204 - fVar288 * fVar284) * fVar242 * fVar184;
              fVar224 = fVar156 * fVar299 + fVar145 * fVar293 + fVar110 * fVar289;
              fVar247 = (float)local_618._0_4_ - fVar304 * fVar304;
              auVar95._0_8_ = CONCAT44((float)local_618._4_4_ - fVar309 * fVar309,fVar247);
              auVar95._8_4_ = fStack_610 - fVar287 * fVar287;
              auVar95._12_4_ = fStack_60c - fVar258 * fVar258;
              fVar255 = -fVar285 * fVar222;
              local_5f8 = CONCAT44(fVar302,fVar206);
              auVar132._8_4_ = auVar95._8_4_;
              auVar132._0_8_ = auVar95._0_8_;
              auVar132._12_4_ = auVar95._12_4_;
              auVar68 = rsqrtss(auVar132,auVar95);
              fVar204 = auVar68._0_4_;
              fVar204 = fVar204 * 1.5 - fVar204 * fVar204 * fVar247 * 0.5 * fVar204;
              if (fVar247 < 0.0) {
                fVar247 = sqrtf(fVar247);
                uVar56 = extraout_RAX;
                uVar59 = extraout_RDX;
              }
              else {
                fVar247 = SQRT(fVar247);
              }
              fVar247 = fVar247 - fVar244;
              fVar242 = ((-fVar277 * fVar221 + -fVar257 * fVar219 + -fVar284 * fVar184) -
                        fVar304 * fVar206) * fVar204 - fVar285;
              fVar204 = ((fVar156 * fVar221 + fVar145 * fVar219 + fVar110 * fVar184) -
                        fVar304 * fVar224) * fVar204;
              auVar172._0_4_ = fVar206 * fVar204 - fVar224 * fVar242;
              auVar195._8_4_ = -fVar255;
              auVar195._0_8_ = CONCAT44(fVar255,fVar242) ^ 0x8000000000000000;
              auVar195._12_4_ = fVar222 * 0.0;
              auVar194._8_8_ = auVar195._8_8_;
              auVar194._0_8_ = CONCAT44(fVar204,fVar242) ^ 0x80000000;
              auVar172._4_4_ = auVar172._0_4_;
              auVar172._8_4_ = auVar172._0_4_;
              auVar172._12_4_ = auVar172._0_4_;
              auVar68 = divps(auVar194,auVar172);
              auVar214._8_4_ = fVar302;
              auVar214._0_8_ = local_5f8;
              auVar214._12_4_ = -(fVar301 * 0.0);
              auVar213._8_8_ = auVar214._8_8_;
              auVar213._0_8_ = CONCAT44(fVar224,fVar206) ^ 0x8000000000000000;
              auVar164 = divps(auVar213,auVar172);
              fVar343 = fVar343 - (fVar247 * auVar164._0_4_ + fVar304 * auVar68._0_4_);
              fVar332 = fVar332 - (fVar247 * auVar164._4_4_ + fVar304 * auVar68._4_4_);
            } while ((fVar245 <= ABS(fVar304)) ||
                    (auVar264._12_4_ * 1.9073486e-06 + fVar162 + fVar245 <= ABS(fVar247)));
            fVar343 = fVar200 + fVar343;
            if ((fVar147 <= fVar343) &&
               (((fVar157 = *(float *)(ray + k * 4 + 0x80), fVar343 <= fVar157 && (0.0 <= fVar332))
                && (fVar332 <= 1.0)))) {
              auVar68 = rsqrtss(_local_618,_local_618);
              fVar162 = auVar68._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar62].ptr;
              uVar56 = (ulong)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar162 = fVar162 * 1.5 +
                          fVar162 * fVar162 * (float)local_618._0_4_ * -0.5 * fVar162;
                fVar184 = fVar184 * fVar162;
                fVar219 = fVar219 * fVar162;
                fVar221 = fVar221 * fVar162;
                fVar162 = fVar285 * fVar184 + fVar284;
                fVar247 = fVar285 * fVar219 + fVar257;
                fVar204 = fVar285 * fVar221 + fVar277;
                fVar206 = fVar219 * fVar284 - fVar257 * fVar184;
                fVar219 = fVar221 * fVar257 - fVar277 * fVar219;
                fVar184 = fVar184 * fVar277 - fVar284 * fVar221;
                fVar255 = fVar247 * fVar219 - fVar184 * fVar162;
                fVar247 = fVar204 * fVar184 - fVar206 * fVar247;
                fVar162 = fVar162 * fVar206 - fVar219 * fVar204;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar343;
                  *(float *)(ray + k * 4 + 0xc0) = fVar247;
                  *(float *)(ray + k * 4 + 0xd0) = fVar162;
                  *(float *)(ray + k * 4 + 0xe0) = fVar255;
                  *(float *)(ray + k * 4 + 0xf0) = fVar332;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x110) = uVar5;
                  *(uint *)(ray + k * 4 + 0x120) = uVar62;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar49 = context->user->instPrimID[0];
                  uVar56 = (ulong)uVar49;
                  *(uint *)(ray + k * 4 + 0x140) = uVar49;
                }
                else {
                  local_358._4_4_ = fVar247;
                  local_358._0_4_ = fVar247;
                  fStack_350 = fVar247;
                  fStack_34c = fVar247;
                  local_348 = fVar162;
                  fStack_344 = fVar162;
                  fStack_340 = fVar162;
                  fStack_33c = fVar162;
                  local_338 = fVar255;
                  fStack_334 = fVar255;
                  fStack_330 = fVar255;
                  fStack_32c = fVar255;
                  local_328 = fVar332;
                  fStack_324 = fVar332;
                  fStack_320 = fVar332;
                  fStack_31c = fVar332;
                  local_318 = 0;
                  uStack_314 = 0;
                  uStack_310 = 0;
                  uStack_30c = 0;
                  local_308 = CONCAT44(uVar5,uVar5);
                  uStack_300 = CONCAT44(uVar5,uVar5);
                  local_2f8 = CONCAT44(uVar62,uVar62);
                  uStack_2f0 = CONCAT44(uVar62,uVar62);
                  local_2e8 = context->user->instID[0];
                  uStack_2e4 = local_2e8;
                  uStack_2e0 = local_2e8;
                  uStack_2dc = local_2e8;
                  local_2d8 = context->user->instPrimID[0];
                  uStack_2d4 = local_2d8;
                  uStack_2d0 = local_2d8;
                  uStack_2cc = local_2d8;
                  *(float *)(ray + k * 4 + 0x80) = fVar343;
                  local_5b8 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_5b8;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.context = context->user;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)local_358;
                  args.N = 4;
                  p_Var10 = pGVar9->intersectionFilterN;
                  auVar369._8_8_ = &local_2e8;
                  auVar369._0_8_ = p_Var10;
                  if (p_Var10 != (RTCFilterFunctionN)0x0) {
                    auVar369 = (*p_Var10)(&args);
                  }
                  uVar59 = auVar369._8_8_;
                  auVar133._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                  auVar133._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                  auVar133._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                  auVar133._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                  uVar49 = movmskps(auVar369._0_4_,auVar133);
                  pRVar55 = (RTCRayN *)(ulong)(uVar49 ^ 0xf);
                  if ((uVar49 ^ 0xf) == 0) {
                    auVar133 = auVar133 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    auVar44._8_8_ = uVar59;
                    auVar44._0_8_ = p_Var10;
                    auVar370._8_8_ = uVar59;
                    auVar370._0_8_ = p_Var10;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (auVar370 = auVar44, ((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar370 = (*p_Var10)(&args);
                    }
                    uVar59 = auVar370._8_8_;
                    auVar96._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                    auVar96._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                    auVar96._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                    auVar96._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                    auVar133 = auVar96 ^ _DAT_01f46b70;
                    uVar49 = movmskps(auVar370._0_4_,auVar96);
                    pRVar55 = (RTCRayN *)(ulong)(uVar49 ^ 0xf);
                    if ((uVar49 ^ 0xf) != 0) {
                      uVar49 = *(uint *)(args.hit + 4);
                      uVar105 = *(uint *)(args.hit + 8);
                      uVar107 = *(uint *)(args.hit + 0xc);
                      *(uint *)(args.ray + 0xc0) =
                           ~auVar96._0_4_ & *(uint *)args.hit |
                           *(uint *)(args.ray + 0xc0) & auVar96._0_4_;
                      *(uint *)(args.ray + 0xc4) =
                           ~auVar96._4_4_ & uVar49 | *(uint *)(args.ray + 0xc4) & auVar96._4_4_;
                      *(uint *)(args.ray + 200) =
                           ~auVar96._8_4_ & uVar105 | *(uint *)(args.ray + 200) & auVar96._8_4_;
                      *(uint *)(args.ray + 0xcc) =
                           ~auVar96._12_4_ & uVar107 | *(uint *)(args.ray + 0xcc) & auVar96._12_4_;
                      uVar49 = *(uint *)(args.hit + 0x14);
                      uVar105 = *(uint *)(args.hit + 0x18);
                      uVar107 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar96._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar96._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar96._4_4_ & uVar49 | *(uint *)(args.ray + 0xd4) & auVar96._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar96._8_4_ & uVar105 | *(uint *)(args.ray + 0xd8) & auVar96._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar96._12_4_ & uVar107 | *(uint *)(args.ray + 0xdc) & auVar96._12_4_;
                      uVar49 = *(uint *)(args.hit + 0x24);
                      uVar105 = *(uint *)(args.hit + 0x28);
                      uVar107 = *(uint *)(args.hit + 0x2c);
                      *(uint *)(args.ray + 0xe0) =
                           ~auVar96._0_4_ & *(uint *)(args.hit + 0x20) |
                           *(uint *)(args.ray + 0xe0) & auVar96._0_4_;
                      *(uint *)(args.ray + 0xe4) =
                           ~auVar96._4_4_ & uVar49 | *(uint *)(args.ray + 0xe4) & auVar96._4_4_;
                      *(uint *)(args.ray + 0xe8) =
                           ~auVar96._8_4_ & uVar105 | *(uint *)(args.ray + 0xe8) & auVar96._8_4_;
                      *(uint *)(args.ray + 0xec) =
                           ~auVar96._12_4_ & uVar107 | *(uint *)(args.ray + 0xec) & auVar96._12_4_;
                      auVar215._0_4_ = *(uint *)(args.ray + 0xf0) & auVar96._0_4_;
                      auVar215._4_4_ = *(uint *)(args.ray + 0xf4) & auVar96._4_4_;
                      auVar215._8_4_ = *(uint *)(args.ray + 0xf8) & auVar96._8_4_;
                      auVar215._12_4_ = *(uint *)(args.ray + 0xfc) & auVar96._12_4_;
                      auVar153._0_4_ = ~auVar96._0_4_ & *(uint *)(args.hit + 0x30);
                      auVar153._4_4_ = ~auVar96._4_4_ & *(uint *)(args.hit + 0x34);
                      auVar153._8_4_ = ~auVar96._8_4_ & *(uint *)(args.hit + 0x38);
                      auVar153._12_4_ = ~auVar96._12_4_ & *(uint *)(args.hit + 0x3c);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar153 | auVar215;
                      uVar49 = *(uint *)(args.hit + 0x44);
                      uVar105 = *(uint *)(args.hit + 0x48);
                      uVar107 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar96._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar96._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar96._4_4_ & uVar49 | *(uint *)(args.ray + 0x104) & auVar96._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar96._8_4_ & uVar105 | *(uint *)(args.ray + 0x108) & auVar96._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar96._12_4_ & uVar107 | *(uint *)(args.ray + 0x10c) & auVar96._12_4_;
                      uVar49 = *(uint *)(args.hit + 0x54);
                      uVar105 = *(uint *)(args.hit + 0x58);
                      uVar107 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar96._0_4_ |
                           ~auVar96._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar96._4_4_ | ~auVar96._4_4_ & uVar49;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar96._8_4_ | ~auVar96._8_4_ & uVar105;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar96._12_4_ | ~auVar96._12_4_ & uVar107;
                      uVar49 = *(uint *)(args.hit + 100);
                      uVar105 = *(uint *)(args.hit + 0x68);
                      uVar107 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar96._0_4_ |
                           ~auVar96._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar96._4_4_ | ~auVar96._4_4_ & uVar49;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar96._8_4_ | ~auVar96._8_4_ & uVar105;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar96._12_4_ | ~auVar96._12_4_ & uVar107;
                      uVar49 = *(uint *)(args.hit + 0x74);
                      uVar105 = *(uint *)(args.hit + 0x78);
                      uVar107 = *(uint *)(args.hit + 0x7c);
                      *(uint *)(args.ray + 0x130) =
                           ~auVar96._0_4_ & *(uint *)(args.hit + 0x70) |
                           *(uint *)(args.ray + 0x130) & auVar96._0_4_;
                      *(uint *)(args.ray + 0x134) =
                           ~auVar96._4_4_ & uVar49 | *(uint *)(args.ray + 0x134) & auVar96._4_4_;
                      *(uint *)(args.ray + 0x138) =
                           ~auVar96._8_4_ & uVar105 | *(uint *)(args.ray + 0x138) & auVar96._8_4_;
                      *(uint *)(args.ray + 0x13c) =
                           ~auVar96._12_4_ & uVar107 | *(uint *)(args.ray + 0x13c) & auVar96._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar96 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar96;
                      pRVar55 = args.ray;
                    }
                  }
                  auVar134._0_4_ = auVar133._0_4_ << 0x1f;
                  auVar134._4_4_ = auVar133._4_4_ << 0x1f;
                  auVar134._8_4_ = auVar133._8_4_ << 0x1f;
                  auVar134._12_4_ = auVar133._12_4_ << 0x1f;
                  iVar47 = movmskps((int)pRVar55,auVar134);
                  uVar56 = CONCAT44((int)((ulong)pRVar55 >> 0x20),iVar47);
                  if (iVar47 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar157;
                  }
                }
              }
            }
LAB_002a168e:
            fVar321 = *(float *)(ray + k * 4 + 0x80);
            auVar93._0_4_ = -(uint)(fVar200 + fVar185 <= fVar321) & local_368._0_4_;
            auVar93._4_4_ = -(uint)(fVar200 + fVar201 <= fVar321) & local_368._4_4_;
            auVar93._8_4_ = -(uint)(fVar200 + fVar203 <= fVar321) & local_368._8_4_;
            auVar93._12_4_ = -(uint)(fVar200 + fVar182 <= fVar321) & local_368._12_4_;
          }
          auVar154._0_4_ = -(uint)(aVar269.v[0] + fVar200 <= fVar321) & uVar63;
          auVar154._4_4_ = -(uint)(aVar269.v[1] + fVar200 <= fVar321) & uVar64;
          auVar154._8_4_ = -(uint)(aVar269.v[2] + fVar200 <= fVar321) & uVar65;
          auVar154._12_4_ = -(uint)(aVar269.v[3] + fVar200 <= fVar321) & uVar66;
          auVar97._0_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar335 <=
                                     ABS((float)local_648._0_4_ * fVar146 +
                                         auVar212._0_4_ * fVar145 + fVar338 * auVar281._0_4_)) &
                             auVar328._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar97._4_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar346 <=
                                     ABS((float)local_648._4_4_ * fVar146 +
                                         auVar212._4_4_ * fVar145 + fVar349 * auVar281._4_4_)) &
                             auVar328._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar97._8_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar159 <=
                                     ABS(fStack_640 * fVar146 +
                                         auVar212._8_4_ * fVar145 + fVar160 * auVar281._8_4_)) &
                             auVar328._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar97._12_4_ =
               -(uint)((int)local_69c <
                      ((int)((-(uint)(fVar179 <=
                                     ABS(fStack_63c * fVar146 +
                                         auVar212._12_4_ * fVar145 + fVar181 * auVar281._12_4_)) &
                             auVar328._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar98 = ~auVar97 & auVar154;
          fVar332 = fVar200 + tp1.lower.field_0.v[0];
          fVar335 = fVar200 + tp1.lower.field_0.v[1];
          fVar338 = fVar200 + tp1.lower.field_0.v[2];
          fVar343 = fVar200 + tp1.lower.field_0.v[3];
          while( true ) {
            local_378 = auVar98;
            iVar47 = movmskps((int)uVar56,auVar98);
            if (iVar47 == 0) break;
            auVar164 = ~auVar98 & _DAT_01f45a30 | auVar98 & (undefined1  [16])vVar46.field_0;
            auVar173._4_4_ = auVar164._0_4_;
            auVar173._0_4_ = auVar164._4_4_;
            auVar173._8_4_ = auVar164._12_4_;
            auVar173._12_4_ = auVar164._8_4_;
            auVar68 = minps(auVar173,auVar164);
            auVar135._0_8_ = auVar68._8_8_;
            auVar135._8_4_ = auVar68._0_4_;
            auVar135._12_4_ = auVar68._4_4_;
            auVar68 = minps(auVar135,auVar68);
            auVar136._0_8_ =
                 CONCAT44(-(uint)(auVar68._4_4_ == auVar164._4_4_) & auVar98._4_4_,
                          -(uint)(auVar68._0_4_ == auVar164._0_4_) & auVar98._0_4_);
            auVar136._8_4_ = -(uint)(auVar68._8_4_ == auVar164._8_4_) & auVar98._8_4_;
            auVar136._12_4_ = -(uint)(auVar68._12_4_ == auVar164._12_4_) & auVar98._12_4_;
            iVar47 = movmskps(iVar47,auVar136);
            if (iVar47 != 0) {
              auVar98._8_4_ = auVar136._8_4_;
              auVar98._0_8_ = auVar136._0_8_;
              auVar98._12_4_ = auVar136._12_4_;
            }
            uVar50 = movmskps(iVar47,auVar98);
            uVar54 = CONCAT44((int)(uVar56 >> 0x20),uVar50);
            uVar56 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
              }
            }
            *(undefined4 *)(local_378 + uVar56 * 4) = 0;
            auVar17._4_4_ = fVar223;
            auVar17._0_4_ = fVar202;
            auVar17._8_4_ = fVar241;
            auVar17._12_4_ = fVar243;
            auVar23._4_4_ = fVar273;
            auVar23._0_4_ = fVar271;
            auVar23._8_4_ = fVar276;
            auVar23._12_4_ = fVar283;
            auVar164 = minps(auVar17,auVar23);
            auVar264 = maxps(auVar17,auVar23);
            auVar21._4_4_ = fVar308;
            auVar21._0_4_ = fVar303;
            auVar21._8_4_ = fVar312;
            auVar21._12_4_ = fVar319;
            auVar19._4_4_ = fVar256;
            auVar19._0_4_ = fVar254;
            auVar19._8_4_ = fVar183;
            auVar19._12_4_ = fVar329;
            auVar68 = minps(auVar21,auVar19);
            auVar164 = minps(auVar164,auVar68);
            auVar68 = maxps(auVar21,auVar19);
            auVar264 = maxps(auVar264,auVar68);
            auVar174._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
            auVar174._8_4_ = auVar164._8_4_ & 0x7fffffff;
            auVar174._12_4_ = auVar164._12_4_ & 0x7fffffff;
            auVar99._0_8_ = auVar264._0_8_ & 0x7fffffff7fffffff;
            auVar99._8_4_ = auVar264._8_4_ & 0x7fffffff;
            auVar99._12_4_ = ABS(auVar264._12_4_);
            auVar68 = maxps(auVar174,auVar99);
            fVar346 = auVar68._4_4_;
            if (auVar68._4_4_ <= auVar68._0_4_) {
              fVar346 = auVar68._0_4_;
            }
            auVar175._8_8_ = auVar68._8_8_;
            auVar175._0_8_ = auVar68._8_8_;
            if (auVar68._8_4_ <= fVar346) {
              auVar175._0_4_ = fVar346;
            }
            fVar157 = auVar175._0_4_ * 1.9073486e-06;
            fVar346 = local_118[uVar56];
            fVar349 = tp1.upper.field_0.v[uVar56];
            lVar52 = 5;
            do {
              bVar61 = lVar52 == 0;
              lVar52 = lVar52 + -1;
              if (bVar61) goto LAB_002a21e9;
              fVar181 = SQRT(fVar178) * 1.9073486e-06 * fVar349;
              fVar159 = 1.0 - fVar346;
              fVar162 = fVar271 * fVar159 + fVar303 * fVar346;
              fVar179 = fVar273 * fVar159 + fVar308 * fVar346;
              fVar247 = fVar276 * fVar159 + fVar312 * fVar346;
              fVar255 = fVar283 * fVar159 + fVar319 * fVar346;
              fVar204 = (fVar202 * fVar159 + fVar271 * fVar346) * fVar159 + fVar346 * fVar162;
              fVar206 = (fVar223 * fVar159 + fVar273 * fVar346) * fVar159 + fVar346 * fVar179;
              fVar184 = (fVar241 * fVar159 + fVar276 * fVar346) * fVar159 + fVar346 * fVar247;
              fVar160 = (fVar243 * fVar159 + fVar283 * fVar346) * fVar159 + fVar346 * fVar255;
              fVar221 = fVar162 * fVar159 + (fVar303 * fVar159 + fVar254 * fVar346) * fVar346;
              fVar224 = fVar179 * fVar159 + (fVar308 * fVar159 + fVar256 * fVar346) * fVar346;
              fVar244 = fVar247 * fVar159 + (fVar312 * fVar159 + fVar183 * fVar346) * fVar346;
              fVar162 = fVar255 * fVar159 + (fVar319 * fVar159 + fVar329 * fVar346) * fVar346;
              fVar287 = fVar159 * fVar160 + fVar346 * fVar162;
              fVar222 = (fVar221 - fVar204) * 3.0;
              fVar242 = (fVar224 - fVar206) * 3.0;
              fVar245 = (fVar244 - fVar184) * 3.0;
              fVar284 = (fVar162 - fVar160) * 3.0;
              fVar160 = fVar159 * 6.0;
              fVar255 = (fVar346 - (fVar159 + fVar159)) * 6.0;
              fVar219 = (fVar159 - (fVar346 + fVar346)) * 6.0;
              fVar247 = fVar346 * 6.0;
              fVar162 = fVar160 * fVar202 +
                        fVar255 * fVar271 + fVar219 * fVar303 + fVar247 * fVar254;
              fVar179 = fVar160 * fVar223 +
                        fVar255 * fVar273 + fVar219 * fVar308 + fVar247 * fVar256;
              fVar160 = fVar160 * fVar241 +
                        fVar255 * fVar276 + fVar219 * fVar312 + fVar247 * fVar183;
              fVar247 = (fVar349 * fVar110 + 0.0) - (fVar159 * fVar204 + fVar346 * fVar221);
              fVar204 = (fVar349 * fVar145 + 0.0) - (fVar159 * fVar206 + fVar346 * fVar224);
              fVar255 = (fVar349 * fVar156 + 0.0) - (fVar159 * fVar184 + fVar346 * fVar244);
              fVar206 = (fVar349 * 0.0 + 0.0) - fVar287;
              fVar159 = fVar204 * fVar204;
              fStack_5c0 = fVar255 * fVar255;
              fStack_5bc = fVar206 * fVar206;
              local_5c8._0_4_ = fVar159 + fVar247 * fVar247 + fStack_5c0;
              local_5c8._4_4_ = fVar159 + fVar159 + fStack_5bc;
              fStack_5c0 = fVar159 + fStack_5c0 + fStack_5c0;
              fStack_5bc = fVar159 + fStack_5bc + fStack_5bc;
              fVar159 = fVar157;
              if (fVar157 <= fVar181) {
                fVar159 = fVar181;
              }
              fVar184 = fVar242 * fVar242 + fVar222 * fVar222 + fVar245 * fVar245;
              auVar68 = ZEXT416((uint)fVar184);
              auVar164 = rsqrtss(ZEXT416((uint)fVar184),auVar68);
              fVar181 = auVar164._0_4_;
              fVar219 = fVar181 * 1.5 - fVar181 * fVar181 * fVar184 * 0.5 * fVar181;
              fVar285 = fVar222 * fVar219;
              fVar288 = fVar242 * fVar219;
              fVar289 = fVar245 * fVar219;
              fVar293 = fVar284 * fVar219;
              fVar257 = fVar245 * fVar160 + fVar242 * fVar179 + fVar222 * fVar162;
              auVar68 = rcpss(auVar68,auVar68);
              fVar181 = (2.0 - fVar184 * auVar68._0_4_) * auVar68._0_4_;
              fVar221 = fVar204 * fVar288;
              fVar224 = fVar255 * fVar289;
              fVar244 = fVar206 * fVar293;
              fVar258 = fVar221 + fVar247 * fVar285 + fVar224;
              fVar277 = fVar221 + fVar221 + fVar244;
              fVar224 = fVar221 + fVar224 + fVar224;
              fVar244 = fVar221 + fVar244 + fVar244;
              fVar221 = (SQRT((float)local_5c8._0_4_) + 1.0) * (fVar157 / SQRT(fVar184)) +
                        SQRT((float)local_5c8._0_4_) * fVar157 + fVar159;
              fVar299 = fVar293 * -fVar284;
              fVar184 = fVar289 * -fVar245 + fVar288 * -fVar242 + fVar285 * -fVar222 +
                        fVar181 * (fVar184 * fVar160 - fVar257 * fVar245) * fVar219 * fVar255 +
                        fVar181 * (fVar184 * fVar179 - fVar257 * fVar242) * fVar219 * fVar204 +
                        fVar181 * (fVar184 * fVar162 - fVar257 * fVar222) * fVar219 * fVar247;
              fVar179 = fVar156 * fVar289 + fVar145 * fVar288 + fVar110 * fVar285;
              fVar160 = (float)local_5c8._0_4_ - fVar258 * fVar258;
              auVar365._0_8_ = CONCAT44((float)local_5c8._4_4_ - fVar277 * fVar277,fVar160);
              auVar365._8_4_ = fStack_5c0 - fVar224 * fVar224;
              auVar365._12_4_ = fStack_5bc - fVar244 * fVar244;
              fVar181 = -fVar284 * fVar206;
              local_5f8 = CONCAT44(fVar299,fVar184);
              auVar137._8_4_ = auVar365._8_4_;
              auVar137._0_8_ = auVar365._0_8_;
              auVar137._12_4_ = auVar365._12_4_;
              auVar68 = rsqrtss(auVar137,auVar365);
              fVar162 = auVar68._0_4_;
              fVar162 = fVar162 * 1.5 - fVar162 * fVar162 * fVar160 * 0.5 * fVar162;
              if (fVar160 < 0.0) {
                fVar160 = sqrtf(fVar160);
                uVar56 = extraout_RAX_00;
                uVar59 = extraout_RDX_00;
              }
              else {
                fVar160 = SQRT(fVar160);
              }
              fVar160 = fVar160 - fVar287;
              fVar219 = ((-fVar245 * fVar255 + -fVar242 * fVar204 + -fVar222 * fVar247) -
                        fVar258 * fVar184) * fVar162 - fVar284;
              fVar162 = ((fVar156 * fVar255 + fVar145 * fVar204 + fVar110 * fVar247) -
                        fVar258 * fVar179) * fVar162;
              auVar176._0_4_ = fVar184 * fVar162 - fVar179 * fVar219;
              auVar197._8_4_ = -fVar181;
              auVar197._0_8_ = CONCAT44(fVar181,fVar219) ^ 0x8000000000000000;
              auVar197._12_4_ = fVar206 * 0.0;
              auVar196._8_8_ = auVar197._8_8_;
              auVar196._0_8_ = CONCAT44(fVar162,fVar219) ^ 0x80000000;
              auVar176._4_4_ = auVar176._0_4_;
              auVar176._8_4_ = auVar176._0_4_;
              auVar176._12_4_ = auVar176._0_4_;
              auVar68 = divps(auVar196,auVar176);
              auVar217._8_4_ = fVar299;
              auVar217._0_8_ = local_5f8;
              auVar217._12_4_ = -(fVar293 * 0.0);
              auVar216._8_8_ = auVar217._8_8_;
              auVar216._0_8_ = CONCAT44(fVar179,fVar184) ^ 0x8000000000000000;
              auVar164 = divps(auVar216,auVar176);
              fVar349 = fVar349 - (fVar160 * auVar164._0_4_ + fVar258 * auVar68._0_4_);
              fVar346 = fVar346 - (fVar160 * auVar164._4_4_ + fVar258 * auVar68._4_4_);
            } while ((fVar221 <= ABS(fVar258)) ||
                    (auVar264._12_4_ * 1.9073486e-06 + fVar159 + fVar221 <= ABS(fVar160)));
            fVar349 = fVar200 + fVar349;
            if ((fVar147 <= fVar349) &&
               (((fVar157 = *(float *)(ray + k * 4 + 0x80), fVar349 <= fVar157 && (0.0 <= fVar346))
                && (fVar346 <= 1.0)))) {
              auVar68 = rsqrtss(_local_5c8,_local_5c8);
              fVar159 = auVar68._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar62].ptr;
              uVar56 = (ulong)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar159 = fVar159 * 1.5 +
                          fVar159 * fVar159 * (float)local_5c8._0_4_ * -0.5 * fVar159;
                fVar247 = fVar247 * fVar159;
                fVar204 = fVar204 * fVar159;
                fVar255 = fVar255 * fVar159;
                fVar159 = fVar284 * fVar247 + fVar222;
                fVar160 = fVar284 * fVar204 + fVar242;
                fVar162 = fVar284 * fVar255 + fVar245;
                fVar181 = fVar204 * fVar222 - fVar242 * fVar247;
                fVar204 = fVar255 * fVar242 - fVar245 * fVar204;
                fVar247 = fVar247 * fVar245 - fVar222 * fVar255;
                fVar179 = fVar160 * fVar204 - fVar247 * fVar159;
                fVar160 = fVar162 * fVar247 - fVar181 * fVar160;
                fVar159 = fVar159 * fVar181 - fVar204 * fVar162;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar349;
                  *(float *)(ray + k * 4 + 0xc0) = fVar160;
                  *(float *)(ray + k * 4 + 0xd0) = fVar159;
                  *(float *)(ray + k * 4 + 0xe0) = fVar179;
                  *(float *)(ray + k * 4 + 0xf0) = fVar346;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x110) = uVar5;
                  *(uint *)(ray + k * 4 + 0x120) = uVar62;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar63 = context->user->instPrimID[0];
                  uVar56 = (ulong)uVar63;
                  *(uint *)(ray + k * 4 + 0x140) = uVar63;
                }
                else {
                  local_358._4_4_ = fVar160;
                  local_358._0_4_ = fVar160;
                  fStack_350 = fVar160;
                  fStack_34c = fVar160;
                  local_348 = fVar159;
                  fStack_344 = fVar159;
                  fStack_340 = fVar159;
                  fStack_33c = fVar159;
                  local_338 = fVar179;
                  fStack_334 = fVar179;
                  fStack_330 = fVar179;
                  fStack_32c = fVar179;
                  local_328 = fVar346;
                  fStack_324 = fVar346;
                  fStack_320 = fVar346;
                  fStack_31c = fVar346;
                  local_318 = 0;
                  uStack_314 = 0;
                  uStack_310 = 0;
                  uStack_30c = 0;
                  local_308 = CONCAT44(uVar5,uVar5);
                  uStack_300 = CONCAT44(uVar5,uVar5);
                  local_2f8 = CONCAT44(uVar62,uVar62);
                  uStack_2f0 = CONCAT44(uVar62,uVar62);
                  local_2e8 = context->user->instID[0];
                  uStack_2e4 = local_2e8;
                  uStack_2e0 = local_2e8;
                  uStack_2dc = local_2e8;
                  local_2d8 = context->user->instPrimID[0];
                  uStack_2d4 = local_2d8;
                  uStack_2d0 = local_2d8;
                  uStack_2cc = local_2d8;
                  *(float *)(ray + k * 4 + 0x80) = fVar349;
                  local_5b8 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_5b8;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.context = context->user;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)local_358;
                  args.N = 4;
                  p_Var10 = pGVar9->intersectionFilterN;
                  auVar371._8_8_ = &local_2e8;
                  auVar371._0_8_ = p_Var10;
                  if (p_Var10 != (RTCFilterFunctionN)0x0) {
                    auVar371 = (*p_Var10)(&args);
                  }
                  uVar59 = auVar371._8_8_;
                  auVar138._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                  auVar138._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                  auVar138._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                  auVar138._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                  uVar63 = movmskps(auVar371._0_4_,auVar138);
                  pRVar55 = (RTCRayN *)(ulong)(uVar63 ^ 0xf);
                  if ((uVar63 ^ 0xf) == 0) {
                    auVar138 = auVar138 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    auVar45._8_8_ = uVar59;
                    auVar45._0_8_ = p_Var10;
                    auVar372._8_8_ = uVar59;
                    auVar372._0_8_ = p_Var10;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (auVar372 = auVar45, ((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar372 = (*p_Var10)(&args);
                    }
                    uVar59 = auVar372._8_8_;
                    auVar100._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                    auVar100._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                    auVar100._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                    auVar100._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                    auVar138 = auVar100 ^ _DAT_01f46b70;
                    uVar63 = movmskps(auVar372._0_4_,auVar100);
                    pRVar55 = (RTCRayN *)(ulong)(uVar63 ^ 0xf);
                    if ((uVar63 ^ 0xf) != 0) {
                      uVar63 = *(uint *)(args.hit + 4);
                      uVar64 = *(uint *)(args.hit + 8);
                      uVar65 = *(uint *)(args.hit + 0xc);
                      *(uint *)(args.ray + 0xc0) =
                           ~auVar100._0_4_ & *(uint *)args.hit |
                           *(uint *)(args.ray + 0xc0) & auVar100._0_4_;
                      *(uint *)(args.ray + 0xc4) =
                           ~auVar100._4_4_ & uVar63 | *(uint *)(args.ray + 0xc4) & auVar100._4_4_;
                      *(uint *)(args.ray + 200) =
                           ~auVar100._8_4_ & uVar64 | *(uint *)(args.ray + 200) & auVar100._8_4_;
                      *(uint *)(args.ray + 0xcc) =
                           ~auVar100._12_4_ & uVar65 | *(uint *)(args.ray + 0xcc) & auVar100._12_4_;
                      uVar63 = *(uint *)(args.hit + 0x14);
                      uVar64 = *(uint *)(args.hit + 0x18);
                      uVar65 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar100._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar100._4_4_ & uVar63 | *(uint *)(args.ray + 0xd4) & auVar100._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar100._8_4_ & uVar64 | *(uint *)(args.ray + 0xd8) & auVar100._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar100._12_4_ & uVar65 | *(uint *)(args.ray + 0xdc) & auVar100._12_4_;
                      uVar63 = *(uint *)(args.hit + 0x24);
                      uVar64 = *(uint *)(args.hit + 0x28);
                      uVar65 = *(uint *)(args.hit + 0x2c);
                      *(uint *)(args.ray + 0xe0) =
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x20) |
                           *(uint *)(args.ray + 0xe0) & auVar100._0_4_;
                      *(uint *)(args.ray + 0xe4) =
                           ~auVar100._4_4_ & uVar63 | *(uint *)(args.ray + 0xe4) & auVar100._4_4_;
                      *(uint *)(args.ray + 0xe8) =
                           ~auVar100._8_4_ & uVar64 | *(uint *)(args.ray + 0xe8) & auVar100._8_4_;
                      *(uint *)(args.ray + 0xec) =
                           ~auVar100._12_4_ & uVar65 | *(uint *)(args.ray + 0xec) & auVar100._12_4_;
                      uVar63 = *(uint *)(args.hit + 0x34);
                      uVar64 = *(uint *)(args.hit + 0x38);
                      uVar65 = *(uint *)(args.hit + 0x3c);
                      *(uint *)(args.ray + 0xf0) =
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x30) |
                           *(uint *)(args.ray + 0xf0) & auVar100._0_4_;
                      *(uint *)(args.ray + 0xf4) =
                           ~auVar100._4_4_ & uVar63 | *(uint *)(args.ray + 0xf4) & auVar100._4_4_;
                      *(uint *)(args.ray + 0xf8) =
                           ~auVar100._8_4_ & uVar64 | *(uint *)(args.ray + 0xf8) & auVar100._8_4_;
                      *(uint *)(args.ray + 0xfc) =
                           ~auVar100._12_4_ & uVar65 | *(uint *)(args.ray + 0xfc) & auVar100._12_4_;
                      uVar63 = *(uint *)(args.hit + 0x44);
                      uVar64 = *(uint *)(args.hit + 0x48);
                      uVar65 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar100._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar100._4_4_ & uVar63 | *(uint *)(args.ray + 0x104) & auVar100._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar100._8_4_ & uVar64 | *(uint *)(args.ray + 0x108) & auVar100._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar100._12_4_ & uVar65 | *(uint *)(args.ray + 0x10c) & auVar100._12_4_
                      ;
                      uVar63 = *(uint *)(args.hit + 0x54);
                      uVar64 = *(uint *)(args.hit + 0x58);
                      uVar65 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar100._0_4_ |
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar100._4_4_ | ~auVar100._4_4_ & uVar63;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar100._8_4_ | ~auVar100._8_4_ & uVar64;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar100._12_4_ | ~auVar100._12_4_ & uVar65
                      ;
                      uVar63 = *(uint *)(args.hit + 100);
                      uVar64 = *(uint *)(args.hit + 0x68);
                      uVar65 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar100._0_4_ |
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar100._4_4_ | ~auVar100._4_4_ & uVar63;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar100._8_4_ | ~auVar100._8_4_ & uVar64;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar100._12_4_ | ~auVar100._12_4_ & uVar65;
                      uVar63 = *(uint *)(args.hit + 0x74);
                      uVar64 = *(uint *)(args.hit + 0x78);
                      uVar65 = *(uint *)(args.hit + 0x7c);
                      *(uint *)(args.ray + 0x130) =
                           ~auVar100._0_4_ & *(uint *)(args.hit + 0x70) |
                           *(uint *)(args.ray + 0x130) & auVar100._0_4_;
                      *(uint *)(args.ray + 0x134) =
                           ~auVar100._4_4_ & uVar63 | *(uint *)(args.ray + 0x134) & auVar100._4_4_;
                      *(uint *)(args.ray + 0x138) =
                           ~auVar100._8_4_ & uVar64 | *(uint *)(args.ray + 0x138) & auVar100._8_4_;
                      *(uint *)(args.ray + 0x13c) =
                           ~auVar100._12_4_ & uVar65 | *(uint *)(args.ray + 0x13c) & auVar100._12_4_
                      ;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar100 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar100;
                      pRVar55 = args.ray;
                    }
                  }
                  auVar139._0_4_ = auVar138._0_4_ << 0x1f;
                  auVar139._4_4_ = auVar138._4_4_ << 0x1f;
                  auVar139._8_4_ = auVar138._8_4_ << 0x1f;
                  auVar139._12_4_ = auVar138._12_4_ << 0x1f;
                  iVar47 = movmskps((int)pRVar55,auVar139);
                  uVar56 = CONCAT44((int)((ulong)pRVar55 >> 0x20),iVar47);
                  if (iVar47 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar157;
                  }
                }
              }
            }
LAB_002a21e9:
            fVar321 = *(float *)(ray + k * 4 + 0x80);
            auVar98._0_4_ = -(uint)(fVar332 <= fVar321) & local_378._0_4_;
            auVar98._4_4_ = -(uint)(fVar335 <= fVar321) & local_378._4_4_;
            auVar98._8_4_ = -(uint)(fVar338 <= fVar321) & local_378._8_4_;
            auVar98._12_4_ = -(uint)(fVar343 <= fVar321) & local_378._12_4_;
          }
          auVar252._0_4_ = auVar151._0_4_ & auVar168._0_4_ & -(uint)(fVar200 + fVar185 <= fVar321);
          auVar252._4_4_ = auVar151._4_4_ & auVar168._4_4_ & -(uint)(fVar200 + fVar201 <= fVar321);
          auVar252._8_4_ = auVar151._8_4_ & auVar168._8_4_ & -(uint)(fVar200 + fVar203 <= fVar321);
          auVar252._12_4_ =
               auVar151._12_4_ & auVar168._12_4_ & -(uint)(fVar200 + fVar182 <= fVar321);
          auVar198._0_4_ =
               auVar97._0_4_ & auVar154._0_4_ & -(uint)(fVar200 + tp1.lower.field_0.v[0] <= fVar321)
          ;
          auVar198._4_4_ =
               auVar97._4_4_ & auVar154._4_4_ & -(uint)(fVar200 + tp1.lower.field_0.v[1] <= fVar321)
          ;
          auVar198._8_4_ =
               auVar97._8_4_ & auVar154._8_4_ & -(uint)(fVar200 + tp1.lower.field_0.v[2] <= fVar321)
          ;
          auVar198._12_4_ =
               auVar97._12_4_ & auVar154._12_4_ &
               -(uint)(fVar200 + tp1.lower.field_0.v[3] <= fVar321);
          uVar63 = movmskps(0,auVar198 | auVar252);
          uVar56 = (ulong)uVar63;
          if (uVar63 != 0) {
            uVar56 = uVar58 * 0x30;
            stack[uVar58].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar198 | auVar252);
            auVar101._0_4_ = (uint)fVar185 & auVar252._0_4_;
            auVar101._4_4_ = (uint)fVar201 & auVar252._4_4_;
            auVar101._8_4_ = (uint)fVar203 & auVar252._8_4_;
            auVar101._12_4_ = (uint)fVar182 & auVar252._12_4_;
            auVar253._0_4_ = ~auVar252._0_4_ & tp1.lower.field_0.i[0];
            auVar253._4_4_ = ~auVar252._4_4_ & tp1.lower.field_0.i[1];
            auVar253._8_4_ = ~auVar252._8_4_ & tp1.lower.field_0.i[2];
            auVar253._12_4_ = ~auVar252._12_4_ & tp1.lower.field_0.i[3];
            stack[uVar58].tlower.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar253 | auVar101);
            stack[uVar58].u0 = fVar158;
            stack[uVar58].u1 = fVar161;
            stack[uVar58].depth = local_69c + 1;
            uVar58 = (ulong)((int)uVar58 + 1);
          }
        }
      }
    }
    do {
      uVar54 = uVar58;
      iVar47 = (int)uVar54;
      if (iVar47 == 0) {
        fVar110 = *(float *)(ray + k * 4 + 0x80);
        auVar143._4_4_ = -(uint)(fVar67 <= fVar110);
        auVar143._0_4_ = -(uint)(fVar180 <= fVar110);
        auVar143._8_4_ = -(uint)(fVar104 <= fVar110);
        auVar143._12_4_ = -(uint)(fVar106 <= fVar110);
        uVar62 = movmskps((int)uVar56,auVar143);
        uVar62 = (uint)uVar60 & uVar62;
        goto LAB_0029fdb1;
      }
      uVar58 = (ulong)(iVar47 - 1U);
      uVar56 = uVar58 * 0x30;
      fVar161 = stack[uVar58].tlower.field_0.v[0];
      fVar332 = stack[uVar58].tlower.field_0.v[1];
      fVar335 = stack[uVar58].tlower.field_0.v[2];
      fVar338 = stack[uVar58].tlower.field_0.v[3];
      fVar158 = *(float *)(ray + k * 4 + 0x80);
      aVar102._0_4_ = -(uint)(fVar200 + fVar161 <= fVar158) & stack[uVar58].valid.field_0.i[0];
      aVar102._4_4_ = -(uint)(fVar200 + fVar332 <= fVar158) & stack[uVar58].valid.field_0.i[1];
      aVar102.i[2] = -(uint)(fVar200 + fVar335 <= fVar158) & stack[uVar58].valid.field_0.i[2];
      aVar102.i[3] = -(uint)(fVar200 + fVar338 <= fVar158) & stack[uVar58].valid.field_0.i[3];
      _local_358 = aVar102;
      uVar63 = movmskps((int)uVar59,(undefined1  [16])aVar102);
      uVar59 = (ulong)uVar63;
    } while (uVar63 == 0);
    auVar140._0_4_ = (uint)fVar161 & aVar102._0_4_;
    auVar140._4_4_ = (uint)fVar332 & aVar102._4_4_;
    auVar140._8_4_ = (uint)fVar335 & aVar102.i[2];
    auVar140._12_4_ = (uint)fVar338 & aVar102.i[3];
    auVar155._0_8_ = CONCAT44(~aVar102._4_4_,~aVar102._0_4_) & 0x7f8000007f800000;
    auVar155._8_4_ = ~aVar102.i[2] & 0x7f800000;
    auVar155._12_4_ = ~aVar102.i[3] & 0x7f800000;
    auVar155 = auVar155 | auVar140;
    auVar177._4_4_ = auVar155._0_4_;
    auVar177._0_4_ = auVar155._4_4_;
    auVar177._8_4_ = auVar155._12_4_;
    auVar177._12_4_ = auVar155._8_4_;
    auVar68 = minps(auVar177,auVar155);
    auVar141._0_8_ = auVar68._8_8_;
    auVar141._8_4_ = auVar68._0_4_;
    auVar141._12_4_ = auVar68._4_4_;
    auVar68 = minps(auVar141,auVar68);
    auVar142._0_8_ =
         CONCAT44(-(uint)(auVar68._4_4_ == auVar155._4_4_) & aVar102._4_4_,
                  -(uint)(auVar68._0_4_ == auVar155._0_4_) & aVar102._0_4_);
    auVar142._8_4_ = -(uint)(auVar68._8_4_ == auVar155._8_4_) & aVar102.i[2];
    auVar142._12_4_ = -(uint)(auVar68._12_4_ == auVar155._12_4_) & aVar102.i[3];
    iVar57 = movmskps(iVar47 - 1U,auVar142);
    if (iVar57 != 0) {
      aVar102.i[2] = auVar142._8_4_;
      aVar102._0_8_ = auVar142._0_8_;
      aVar102.i[3] = auVar142._12_4_;
    }
    pSVar53 = stack + uVar58;
    uVar63 = movmskps(iVar57,(undefined1  [16])aVar102);
    lVar52 = 0;
    if (uVar63 != 0) {
      for (; (uVar63 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
      }
    }
    *(undefined4 *)(local_358 + lVar52 * 4) = 0;
    uVar6 = stack[uVar58].u0;
    uVar7 = stack[uVar58].u1;
    local_69c = stack[uVar58].depth;
    iVar57 = movmskps(local_69c,(undefined1  [16])_local_358);
    uVar59 = (ulong)(iVar47 - 1);
    if (iVar57 != 0) {
      uVar59 = uVar54;
    }
    (pSVar53->valid).field_0 = _local_358;
    fVar158 = (float)uVar7 - (float)uVar6;
    args.valid = (int *)CONCAT44(fVar158 * 0.33333334 + (float)uVar6,fVar158 * 0.0 + (float)uVar6);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar158 * 1.0 + (float)uVar6,fVar158 * 0.6666667 + (float)uVar6);
    fVar158 = *(float *)((long)&args.valid + lVar52 * 4);
    fVar161 = *(float *)((long)&args.valid + lVar52 * 4 + 4);
    uVar58 = uVar59;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }